

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiMBIntersectorK<4,4>::
     occluded_hn<embree::avx512::OrientedCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx512::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  BBox1f BVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  uint uVar4;
  uint uVar5;
  Geometry *pGVar6;
  __int_type_conflict _Var7;
  RTCFilterFunctionN p_Var8;
  long lVar9;
  __int_type_conflict _Var10;
  long lVar11;
  long lVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  byte bVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  uint uVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  ulong uVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  ulong uVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 in_YmmResult [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar75 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar114 [32];
  undefined1 auVar116 [32];
  undefined1 auVar118 [32];
  undefined1 auVar80 [16];
  undefined1 auVar120 [32];
  undefined1 auVar122 [32];
  int iVar124;
  undefined4 uVar125;
  vint4 bi_2;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  vint4 bi_1;
  undefined1 auVar130 [16];
  vint4 bi;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [32];
  vfloat4 b0;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  float fVar150;
  float fVar159;
  float fVar160;
  vint4 ai;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar161;
  undefined1 auVar158 [32];
  vint4 ai_1;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  float fVar170;
  vint4 ai_2;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  float fVar198;
  float fVar204;
  vfloat4 a0_2;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  float fVar205;
  float fVar206;
  float fVar216;
  float fVar218;
  undefined1 auVar207 [16];
  float fVar217;
  float fVar219;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar232;
  vfloat4 b0_2;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  vfloat4 a0_3;
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [64];
  undefined1 auVar254 [64];
  undefined1 auVar255 [64];
  undefined1 auVar256 [64];
  undefined1 auVar257 [64];
  undefined1 auVar258 [64];
  undefined1 auVar259 [64];
  undefined1 in_ZMM28 [64];
  undefined1 auVar260 [64];
  undefined1 auVar261 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  undefined1 local_378 [16];
  long local_368;
  Primitive *local_360;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  RTCHitN local_e8 [16];
  undefined1 local_d8 [16];
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [16];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined1 local_88 [16];
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  BBox1f cv_stack [4];
  undefined1 auVar113 [32];
  undefined1 auVar115 [32];
  undefined1 auVar117 [32];
  undefined1 auVar119 [32];
  undefined1 auVar121 [32];
  undefined1 auVar123 [32];
  float fVar143;
  float fVar149;
  undefined1 auVar244 [32];
  
  uVar21 = (ulong)(byte)prim[1];
  auVar45 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar21 * 4 + 6)));
  auVar40 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar21 * 5 + 6)));
  auVar41 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar21 * 6 + 6)));
  auVar42 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar21 * 0xf + 6)));
  lVar25 = uVar21 * 0x25;
  auVar43 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)prim[1] * 0x10 + 6)));
  auVar44 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar21 * 0x11 + 6)));
  auVar46 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar21 * 0x1a + 6)));
  auVar47 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar21 * 0x1b + 6)));
  auVar48 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar21 * 0x1c + 6)));
  auVar109._16_16_ = in_YmmResult._16_16_;
  auVar34 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(prim + lVar25 + 0x12)));
  auVar49 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar49 = vinsertps_avx(auVar49,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar35 = vsubps_avx512vl(auVar49,*(undefined1 (*) [16])(prim + lVar25 + 6));
  fVar150 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar25 + 0x16)) *
            *(float *)(prim + lVar25 + 0x1a);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *(ulong *)(prim + uVar21 * 7 + 6);
  auVar53 = vpmovsxwd_avx(auVar49);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = *(ulong *)(prim + uVar21 * 0xb + 6);
  auVar54 = vpmovsxwd_avx(auVar52);
  auVar36 = vpbroadcastd_avx512vl();
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(prim + uVar21 * 9 + 6);
  auVar37 = vpmovsxwd_avx512vl(auVar51);
  auVar253 = ZEXT1664(auVar37);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *(ulong *)(prim + uVar21 * 0xd + 6);
  auVar38 = vpmovsxwd_avx512vl(auVar50);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = *(ulong *)(prim + uVar21 * 0x12 + 6);
  auVar55 = vpmovsxwd_avx(auVar55);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = *(ulong *)(prim + uVar21 * 0x16 + 6);
  auVar56 = vpmovsxwd_avx(auVar56);
  auVar58._8_8_ = 0;
  auVar58._0_8_ = *(ulong *)(prim + uVar21 * 0x14 + 6);
  auVar58 = vpmovsxwd_avx(auVar58);
  auVar49 = vinsertps_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                              ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar49 = vinsertps_avx512f(auVar49,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar35 = vmulps_avx512vl(auVar34,auVar35);
  auVar34 = vmulps_avx512vl(auVar34,auVar49);
  auVar39 = vcvtdq2ps_avx512vl(auVar45);
  auVar40 = vcvtdq2ps_avx512vl(auVar40);
  auVar41 = vcvtdq2ps_avx512vl(auVar41);
  auVar42 = vcvtdq2ps_avx512vl(auVar42);
  auVar43 = vcvtdq2ps_avx512vl(auVar43);
  auVar49 = vcvtdq2ps_avx(auVar44);
  auVar52 = vcvtdq2ps_avx(auVar46);
  auVar51 = vcvtdq2ps_avx(auVar47);
  auVar50 = vcvtdq2ps_avx(auVar48);
  auVar44 = vbroadcastss_avx512vl(auVar34);
  auVar45 = vshufps_avx512vl(auVar34,auVar34,0x55);
  auVar46 = vshufps_avx512vl(auVar34,auVar34,0xaa);
  auVar47 = vmulps_avx512vl(auVar46,auVar41);
  auVar61._0_4_ = auVar46._0_4_ * auVar49._0_4_;
  auVar61._4_4_ = auVar46._4_4_ * auVar49._4_4_;
  auVar61._8_4_ = auVar46._8_4_ * auVar49._8_4_;
  auVar61._12_4_ = auVar46._12_4_ * auVar49._12_4_;
  auVar34._0_4_ = auVar50._0_4_ * auVar46._0_4_;
  auVar34._4_4_ = auVar50._4_4_ * auVar46._4_4_;
  auVar34._8_4_ = auVar50._8_4_ * auVar46._8_4_;
  auVar34._12_4_ = auVar50._12_4_ * auVar46._12_4_;
  auVar46 = vfmadd231ps_avx512vl(auVar47,auVar45,auVar40);
  auVar47 = vfmadd231ps_avx512vl(auVar61,auVar45,auVar43);
  auVar45 = vfmadd231ps_fma(auVar34,auVar51,auVar45);
  auVar46 = vfmadd231ps_avx512vl(auVar46,auVar44,auVar39);
  auVar47 = vfmadd231ps_avx512vl(auVar47,auVar44,auVar42);
  auVar45 = vfmadd231ps_fma(auVar45,auVar52,auVar44);
  auVar44 = vbroadcastss_avx512vl(auVar35);
  auVar48 = vshufps_avx512vl(auVar35,auVar35,0x55);
  auVar34 = vshufps_avx512vl(auVar35,auVar35,0xaa);
  auVar41 = vmulps_avx512vl(auVar34,auVar41);
  auVar49 = vmulps_avx512vl(auVar34,auVar49);
  auVar50 = vmulps_avx512vl(auVar34,auVar50);
  auVar40 = vfmadd231ps_avx512vl(auVar41,auVar48,auVar40);
  auVar49 = vfmadd231ps_avx512vl(auVar49,auVar48,auVar43);
  auVar51 = vfmadd231ps_avx512vl(auVar50,auVar48,auVar51);
  auVar35 = vfmadd231ps_avx512vl(auVar40,auVar44,auVar39);
  auVar39 = vfmadd231ps_avx512vl(auVar49,auVar44,auVar42);
  auVar34 = vfmadd231ps_fma(auVar51,auVar44,auVar52);
  auVar49 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar259 = ZEXT1664(auVar49);
  auVar52 = vandps_avx512vl(auVar46,auVar49);
  auVar64._8_4_ = 0x219392ef;
  auVar64._0_8_ = 0x219392ef219392ef;
  auVar64._12_4_ = 0x219392ef;
  uVar27 = vcmpps_avx512vl(auVar52,auVar64,1);
  bVar28 = (bool)((byte)uVar27 & 1);
  auVar57._0_4_ = (uint)bVar28 * 0x219392ef | (uint)!bVar28 * auVar46._0_4_;
  bVar28 = (bool)((byte)(uVar27 >> 1) & 1);
  auVar57._4_4_ = (uint)bVar28 * 0x219392ef | (uint)!bVar28 * auVar46._4_4_;
  bVar28 = (bool)((byte)(uVar27 >> 2) & 1);
  auVar57._8_4_ = (uint)bVar28 * 0x219392ef | (uint)!bVar28 * auVar46._8_4_;
  bVar28 = (bool)((byte)(uVar27 >> 3) & 1);
  auVar57._12_4_ = (uint)bVar28 * 0x219392ef | (uint)!bVar28 * auVar46._12_4_;
  auVar52 = vandps_avx512vl(auVar47,auVar49);
  uVar27 = vcmpps_avx512vl(auVar52,auVar64,1);
  bVar28 = (bool)((byte)uVar27 & 1);
  auVar59._0_4_ = (uint)bVar28 * 0x219392ef | (uint)!bVar28 * auVar47._0_4_;
  bVar28 = (bool)((byte)(uVar27 >> 1) & 1);
  auVar59._4_4_ = (uint)bVar28 * 0x219392ef | (uint)!bVar28 * auVar47._4_4_;
  bVar28 = (bool)((byte)(uVar27 >> 2) & 1);
  auVar59._8_4_ = (uint)bVar28 * 0x219392ef | (uint)!bVar28 * auVar47._8_4_;
  bVar28 = (bool)((byte)(uVar27 >> 3) & 1);
  auVar59._12_4_ = (uint)bVar28 * 0x219392ef | (uint)!bVar28 * auVar47._12_4_;
  auVar49 = vandps_avx512vl(auVar45,auVar49);
  uVar27 = vcmpps_avx512vl(auVar49,auVar64,1);
  bVar28 = (bool)((byte)uVar27 & 1);
  auVar60._0_4_ = (uint)bVar28 * 0x219392ef | (uint)!bVar28 * auVar45._0_4_;
  bVar28 = (bool)((byte)(uVar27 >> 1) & 1);
  auVar60._4_4_ = (uint)bVar28 * 0x219392ef | (uint)!bVar28 * auVar45._4_4_;
  bVar28 = (bool)((byte)(uVar27 >> 2) & 1);
  auVar60._8_4_ = (uint)bVar28 * 0x219392ef | (uint)!bVar28 * auVar45._8_4_;
  bVar28 = (bool)((byte)(uVar27 >> 3) & 1);
  auVar60._12_4_ = (uint)bVar28 * 0x219392ef | (uint)!bVar28 * auVar45._12_4_;
  auVar52 = vrcp14ps_avx512vl(auVar57);
  auVar65._8_4_ = 0x3f800000;
  auVar65._0_8_ = 0x3f8000003f800000;
  auVar65._12_4_ = 0x3f800000;
  auVar49 = vfnmadd213ps_fma(auVar57,auVar52,auVar65);
  auVar50 = vfmadd132ps_fma(auVar49,auVar52,auVar52);
  auVar52 = vrcp14ps_avx512vl(auVar59);
  auVar49 = vfnmadd213ps_fma(auVar59,auVar52,auVar65);
  auVar44 = vfmadd132ps_fma(auVar49,auVar52,auVar52);
  auVar52 = vrcp14ps_avx512vl(auVar60);
  auVar49 = vfnmadd213ps_fma(auVar60,auVar52,auVar65);
  auVar46 = vfmadd132ps_fma(auVar49,auVar52,auVar52);
  auVar62._4_4_ = fVar150;
  auVar62._0_4_ = fVar150;
  auVar62._8_4_ = fVar150;
  auVar62._12_4_ = fVar150;
  auVar49 = vcvtdq2ps_avx(auVar53);
  auVar52 = vcvtdq2ps_avx(auVar54);
  auVar52 = vsubps_avx(auVar52,auVar49);
  auVar47 = vfmadd213ps_fma(auVar52,auVar62,auVar49);
  auVar52 = vcvtdq2ps_avx512vl(auVar37);
  auVar49 = vcvtdq2ps_avx512vl(auVar38);
  auVar49 = vsubps_avx(auVar49,auVar52);
  auVar48 = vfmadd213ps_fma(auVar49,auVar62,auVar52);
  auVar49 = vcvtdq2ps_avx(auVar55);
  auVar52 = vcvtdq2ps_avx(auVar56);
  auVar52 = vsubps_avx(auVar52,auVar49);
  auVar55 = vfmadd213ps_fma(auVar52,auVar62,auVar49);
  auVar49 = vcvtdq2ps_avx(auVar58);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *(ulong *)(prim + uVar21 * 0x18 + 6);
  auVar52 = vpmovsxwd_avx(auVar45);
  auVar52 = vcvtdq2ps_avx(auVar52);
  auVar51 = vsubps_avx(auVar52,auVar49);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)(prim + uVar21 * 0x1d + 6);
  auVar52 = vpmovsxwd_avx(auVar40);
  auVar51 = vfmadd213ps_fma(auVar51,auVar62,auVar49);
  auVar49 = vcvtdq2ps_avx(auVar52);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *(ulong *)(prim + uVar21 * 0x21 + 6);
  auVar52 = vpmovsxwd_avx(auVar41);
  auVar52 = vcvtdq2ps_avx(auVar52);
  auVar52 = vsubps_avx(auVar52,auVar49);
  auVar56 = vfmadd213ps_fma(auVar52,auVar62,auVar49);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(prim + uVar21 * 0x1f + 6);
  auVar49 = vpmovsxwd_avx(auVar42);
  auVar49 = vcvtdq2ps_avx(auVar49);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + uVar21 * 0x23 + 6);
  auVar52 = vpmovsxwd_avx(auVar43);
  auVar52 = vcvtdq2ps_avx(auVar52);
  auVar52 = vsubps_avx(auVar52,auVar49);
  auVar52 = vfmadd213ps_fma(auVar52,auVar62,auVar49);
  auVar49 = vsubps_avx512vl(auVar47,auVar35);
  auVar37._0_4_ = auVar50._0_4_ * auVar49._0_4_;
  auVar37._4_4_ = auVar50._4_4_ * auVar49._4_4_;
  auVar37._8_4_ = auVar50._8_4_ * auVar49._8_4_;
  auVar37._12_4_ = auVar50._12_4_ * auVar49._12_4_;
  auVar49 = vsubps_avx512vl(auVar48,auVar35);
  auVar35._0_4_ = auVar50._0_4_ * auVar49._0_4_;
  auVar35._4_4_ = auVar50._4_4_ * auVar49._4_4_;
  auVar35._8_4_ = auVar50._8_4_ * auVar49._8_4_;
  auVar35._12_4_ = auVar50._12_4_ * auVar49._12_4_;
  auVar49 = vsubps_avx(auVar55,auVar39);
  auVar63._0_4_ = auVar44._0_4_ * auVar49._0_4_;
  auVar63._4_4_ = auVar44._4_4_ * auVar49._4_4_;
  auVar63._8_4_ = auVar44._8_4_ * auVar49._8_4_;
  auVar63._12_4_ = auVar44._12_4_ * auVar49._12_4_;
  auVar49 = vsubps_avx(auVar51,auVar39);
  auVar54._0_4_ = auVar44._0_4_ * auVar49._0_4_;
  auVar54._4_4_ = auVar44._4_4_ * auVar49._4_4_;
  auVar54._8_4_ = auVar44._8_4_ * auVar49._8_4_;
  auVar54._12_4_ = auVar44._12_4_ * auVar49._12_4_;
  auVar49 = vsubps_avx(auVar56,auVar34);
  auVar39._0_4_ = auVar46._0_4_ * auVar49._0_4_;
  auVar39._4_4_ = auVar46._4_4_ * auVar49._4_4_;
  auVar39._8_4_ = auVar46._8_4_ * auVar49._8_4_;
  auVar39._12_4_ = auVar46._12_4_ * auVar49._12_4_;
  auVar49 = vsubps_avx(auVar52,auVar34);
  auVar53._0_4_ = auVar46._0_4_ * auVar49._0_4_;
  auVar53._4_4_ = auVar46._4_4_ * auVar49._4_4_;
  auVar53._8_4_ = auVar46._8_4_ * auVar49._8_4_;
  auVar53._12_4_ = auVar46._12_4_ * auVar49._12_4_;
  auVar49 = vpminsd_avx(auVar37,auVar35);
  auVar52 = vpminsd_avx(auVar63,auVar54);
  auVar49 = vmaxps_avx(auVar49,auVar52);
  auVar52 = vpminsd_avx(auVar39,auVar53);
  uVar125 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar44._4_4_ = uVar125;
  auVar44._0_4_ = uVar125;
  auVar44._8_4_ = uVar125;
  auVar44._12_4_ = uVar125;
  auVar52 = vmaxps_avx512vl(auVar52,auVar44);
  auVar49 = vmaxps_avx(auVar49,auVar52);
  auVar46._8_4_ = 0x3f7ffffa;
  auVar46._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar46._12_4_ = 0x3f7ffffa;
  auVar51 = vmulps_avx512vl(auVar49,auVar46);
  auVar49 = vpmaxsd_avx(auVar37,auVar35);
  auVar52 = vpmaxsd_avx(auVar63,auVar54);
  auVar49 = vminps_avx(auVar49,auVar52);
  auVar52 = vpmaxsd_avx(auVar39,auVar53);
  uVar125 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar47._4_4_ = uVar125;
  auVar47._0_4_ = uVar125;
  auVar47._8_4_ = uVar125;
  auVar47._12_4_ = uVar125;
  auVar52 = vminps_avx512vl(auVar52,auVar47);
  auVar49 = vminps_avx(auVar49,auVar52);
  auVar48._8_4_ = 0x3f800003;
  auVar48._0_8_ = 0x3f8000033f800003;
  auVar48._12_4_ = 0x3f800003;
  auVar49 = vmulps_avx512vl(auVar49,auVar48);
  uVar13 = vcmpps_avx512vl(auVar51,auVar49,2);
  uVar14 = vpcmpgtd_avx512vl(auVar36,_DAT_01f4ad30);
  uVar27 = (ulong)((byte)uVar13 & 0xf & (byte)uVar14);
  auVar49 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar52 = vpxord_avx512vl(auVar38,auVar38);
  auVar254 = ZEXT1664(auVar52);
  auVar109._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar258 = ZEXT1664(auVar109._0_16_);
  local_360 = prim;
LAB_0192f3d2:
  if (uVar27 == 0) {
LAB_01931371:
    return uVar27 != 0;
  }
  lVar25 = 0;
  for (uVar21 = uVar27; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
    lVar25 = lVar25 + 1;
  }
  uVar4 = *(uint *)(local_360 + 2);
  pGVar6 = (context->scene->geometries).items[uVar4].ptr;
  fVar150 = (pGVar6->time_range).lower;
  fVar150 = pGVar6->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar150) / ((pGVar6->time_range).upper - fVar150));
  auVar52 = vroundss_avx(ZEXT416((uint)fVar150),ZEXT416((uint)fVar150),9);
  auVar52 = vminss_avx(auVar52,ZEXT416((uint)(pGVar6->fnumTimeSegments + -1.0)));
  auVar90._16_16_ = auVar109._16_16_;
  auVar43 = vmaxss_avx512f(auVar254._0_16_,auVar52);
  uVar21 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           (ulong)*(uint *)(local_360 + lVar25 * 4 + 6) *
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var7 = pGVar6[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar26 = (long)(int)auVar43._0_4_ * 0x38;
  lVar22 = *(long *)(_Var7 + 0x10 + lVar26);
  auVar52 = *(undefined1 (*) [16])(*(long *)(_Var7 + lVar26) + lVar22 * uVar21);
  lVar25 = uVar21 + 1;
  auVar50 = *(undefined1 (*) [16])(*(long *)(_Var7 + lVar26) + lVar22 * lVar25);
  p_Var8 = pGVar6[4].occlusionFilterN;
  lVar22 = *(long *)&pGVar6[4].fnumTimeSegments;
  lVar9 = *(long *)(lVar22 + 0x10 + lVar26);
  auVar55 = *(undefined1 (*) [16])(*(long *)(lVar22 + lVar26) + lVar9 * uVar21);
  auVar56 = *(undefined1 (*) [16])(*(long *)(lVar22 + lVar26) + lVar9 * lVar25);
  _Var10 = pGVar6[5].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar9 = *(long *)(_Var10 + 0x10 + lVar26);
  lVar11 = *(long *)(_Var7 + 0x38 + lVar26);
  lVar12 = *(long *)(_Var7 + 0x48 + lVar26);
  auVar58 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar21);
  auVar45 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar25);
  lVar11 = *(long *)(lVar22 + 0x38 + lVar26);
  lVar22 = *(long *)(lVar22 + 0x48 + lVar26);
  auVar40 = *(undefined1 (*) [16])(lVar11 + lVar22 * uVar21);
  auVar41 = *(undefined1 (*) [16])(lVar11 + lVar22 * lVar25);
  auVar44 = vpbroadcastd_avx512vl();
  auVar42 = vmovdqa64_avx512vl(auVar44);
  lVar22 = *(long *)(_Var10 + 0x38 + lVar26);
  lVar11 = *(long *)(_Var10 + 0x48 + lVar26);
  auVar46 = vsubss_avx512f(ZEXT416((uint)fVar150),auVar43);
  auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
  auVar43 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (*(long *)(p_Var8 + lVar26) + *(long *)(p_Var8 + lVar26 + 0x10) * uVar21),
                       auVar52,auVar47);
  auVar48 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (*(long *)(p_Var8 + lVar26) + *(long *)(p_Var8 + lVar26 + 0x10) * lVar25),
                       auVar50,auVar47);
  auVar53 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])(*(long *)(_Var10 + lVar26) + lVar9 * uVar21),auVar55,
                       auVar47);
  auVar54 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])(*(long *)(_Var10 + lVar26) + lVar9 * lVar25),auVar56,
                       auVar47);
  auVar90._0_16_ = vxorps_avx512vl(in_ZMM28._0_16_,in_ZMM28._0_16_);
  auVar34 = vmulps_avx512vl(auVar50,auVar90._0_16_);
  auVar34 = vfmadd231ps_avx512vl(auVar34,auVar48,auVar90._0_16_);
  auVar44 = vpxord_avx512vl(auVar44,auVar44);
  auVar44 = vfmadd213ps_avx512vl(auVar44,auVar43,auVar34);
  auVar35 = vaddps_avx512vl(auVar52,auVar44);
  auVar59 = auVar258._0_16_;
  auVar44 = vfmadd231ps_avx512vl(auVar34,auVar43,auVar59);
  auVar34 = vfnmadd231ps_avx512vl(auVar44,auVar52,auVar59);
  auVar44 = vmulps_avx512vl(auVar56,auVar90._0_16_);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar54,auVar90._0_16_);
  auVar36 = vpxord_avx512vl(auVar253._0_16_,auVar253._0_16_);
  auVar36 = vfmadd213ps_avx512vl(auVar36,auVar53,auVar44);
  auVar37 = vaddps_avx512vl(auVar55,auVar36);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar53,auVar59);
  auVar44 = vfnmadd231ps_avx512vl(auVar44,auVar55,auVar59);
  auVar36 = vxorps_avx512vl(auVar36,auVar36);
  auVar36 = vfmadd213ps_avx512vl(auVar36,auVar48,auVar50);
  auVar36 = vfmadd231ps_avx512vl(auVar36,auVar43,auVar90._0_16_);
  auVar36 = vfmadd231ps_avx512vl(auVar36,auVar52,auVar90._0_16_);
  auVar50 = vmulps_avx512vl(auVar50,auVar59);
  auVar50 = vfnmadd231ps_avx512vl(auVar50,auVar59,auVar48);
  auVar50 = vfmadd231ps_avx512vl(auVar50,auVar90._0_16_,auVar43);
  auVar48 = vfnmadd231ps_avx512vl(auVar50,auVar90._0_16_,auVar52);
  auVar52 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar54,auVar56);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar53,auVar90._0_16_);
  auVar50 = vfmadd231ps_avx512vl(auVar52,auVar55,auVar90._0_16_);
  auVar52 = vmulps_avx512vl(auVar56,auVar59);
  auVar52 = vfnmadd231ps_avx512vl(auVar52,auVar59,auVar54);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar90._0_16_,auVar53);
  auVar53 = vfnmadd231ps_avx512vl(auVar52,auVar90._0_16_,auVar55);
  auVar52 = vshufps_avx(auVar34,auVar34,0xc9);
  auVar55 = vshufps_avx512vl(auVar37,auVar37,0xc9);
  fVar217 = auVar34._0_4_;
  auVar83._0_4_ = fVar217 * auVar55._0_4_;
  fVar218 = auVar34._4_4_;
  auVar83._4_4_ = fVar218 * auVar55._4_4_;
  fVar143 = auVar34._8_4_;
  auVar83._8_4_ = fVar143 * auVar55._8_4_;
  fVar149 = auVar34._12_4_;
  auVar83._12_4_ = fVar149 * auVar55._12_4_;
  auVar55 = vfmsub231ps_avx512vl(auVar83,auVar52,auVar37);
  auVar55 = vshufps_avx(auVar55,auVar55,0xc9);
  auVar56 = vshufps_avx512vl(auVar44,auVar44,0xc9);
  auVar162._0_4_ = fVar217 * auVar56._0_4_;
  auVar162._4_4_ = fVar218 * auVar56._4_4_;
  auVar162._8_4_ = fVar143 * auVar56._8_4_;
  auVar162._12_4_ = fVar149 * auVar56._12_4_;
  auVar52 = vfmsub231ps_avx512vl(auVar162,auVar52,auVar44);
  auVar56 = vshufps_avx(auVar52,auVar52,0xc9);
  auVar44 = vshufps_avx512vl(auVar48,auVar48,0xc9);
  auVar52 = vshufps_avx(auVar50,auVar50,0xc9);
  auVar52 = vmulps_avx512vl(auVar48,auVar52);
  auVar52 = vfmsub231ps_fma(auVar52,auVar44,auVar50);
  auVar43 = vshufps_avx(auVar52,auVar52,0xc9);
  auVar52 = vshufps_avx(auVar53,auVar53,0xc9);
  auVar52 = vmulps_avx512vl(auVar48,auVar52);
  auVar52 = vfmsub231ps_fma(auVar52,auVar44,auVar53);
  auVar44 = vshufps_avx(auVar52,auVar52,0xc9);
  auVar52 = vdpps_avx(auVar55,auVar55,0x7f);
  auVar89._4_28_ = auVar90._4_28_;
  auVar89._0_4_ = auVar52._0_4_;
  auVar50 = vrsqrt14ss_avx512f(auVar90._0_16_,auVar89._0_16_);
  auVar53 = vmulss_avx512f(auVar50,ZEXT416(0x3fc00000));
  auVar54 = vmulss_avx512f(auVar52,ZEXT416(0x3f000000));
  auVar54 = vmulss_avx512f(auVar54,auVar50);
  auVar50 = vmulss_avx512f(auVar54,ZEXT416((uint)(auVar50._0_4_ * auVar50._0_4_)));
  fVar222 = auVar53._0_4_ - auVar50._0_4_;
  auVar176._4_4_ = fVar222;
  auVar176._0_4_ = fVar222;
  auVar176._8_4_ = fVar222;
  auVar176._12_4_ = fVar222;
  auVar50 = vdpps_avx(auVar55,auVar56,0x7f);
  auVar53 = vmulps_avx512vl(auVar55,auVar176);
  auVar54 = vbroadcastss_avx512vl(auVar52);
  auVar56 = vmulps_avx512vl(auVar54,auVar56);
  fVar150 = auVar50._0_4_;
  auVar78._0_4_ = fVar150 * auVar55._0_4_;
  auVar78._4_4_ = fVar150 * auVar55._4_4_;
  auVar78._8_4_ = fVar150 * auVar55._8_4_;
  auVar78._12_4_ = fVar150 * auVar55._12_4_;
  auVar55 = vsubps_avx(auVar56,auVar78);
  auVar50 = vrcp14ss_avx512f(auVar90._0_16_,auVar89._0_16_);
  auVar52 = vfnmadd213ss_avx512f(auVar52,auVar50,ZEXT416(0x40000000));
  fVar150 = auVar50._0_4_ * auVar52._0_4_;
  auVar52 = vdpps_avx(auVar43,auVar43,0x7f);
  auVar106._16_16_ = auVar90._16_16_;
  auVar106._0_16_ = auVar90._0_16_;
  auVar91._4_28_ = auVar106._4_28_;
  auVar91._0_4_ = auVar52._0_4_;
  auVar50 = vrsqrt14ss_avx512f(auVar90._0_16_,auVar91._0_16_);
  auVar56 = vmulss_avx512f(auVar50,ZEXT416(0x3fc00000));
  auVar54 = vmulss_avx512f(auVar52,ZEXT416(0x3f000000));
  fVar170 = auVar50._0_4_;
  fVar206 = auVar56._0_4_ - auVar54._0_4_ * fVar170 * fVar170 * fVar170;
  auVar177._0_4_ = auVar43._0_4_ * fVar206;
  auVar177._4_4_ = auVar43._4_4_ * fVar206;
  auVar177._8_4_ = auVar43._8_4_ * fVar206;
  auVar177._12_4_ = auVar43._12_4_ * fVar206;
  auVar50 = vdpps_avx(auVar43,auVar44,0x7f);
  auVar56 = vbroadcastss_avx512vl(auVar52);
  auVar56 = vmulps_avx512vl(auVar56,auVar44);
  fVar170 = auVar50._0_4_;
  auVar38._0_4_ = fVar170 * auVar43._0_4_;
  auVar38._4_4_ = fVar170 * auVar43._4_4_;
  auVar38._8_4_ = fVar170 * auVar43._8_4_;
  auVar38._12_4_ = fVar170 * auVar43._12_4_;
  auVar50 = vsubps_avx(auVar56,auVar38);
  auVar56 = vrcp14ss_avx512f(auVar90._0_16_,auVar91._0_16_);
  auVar52 = vfnmadd213ss_avx512f(auVar52,auVar56,ZEXT416(0x40000000));
  fVar170 = auVar56._0_4_ * auVar52._0_4_;
  auVar56 = vshufps_avx512vl(auVar35,auVar35,0xff);
  auVar43 = vmulps_avx512vl(auVar56,auVar53);
  auVar44 = vsubps_avx512vl(auVar35,auVar43);
  auVar52 = vshufps_avx(auVar34,auVar34,0xff);
  auVar52 = vmulps_avx512vl(auVar52,auVar53);
  auVar137._0_4_ = auVar52._0_4_ + auVar56._0_4_ * fVar222 * fVar150 * auVar55._0_4_;
  auVar137._4_4_ = auVar52._4_4_ + auVar56._4_4_ * fVar222 * fVar150 * auVar55._4_4_;
  auVar137._8_4_ = auVar52._8_4_ + auVar56._8_4_ * fVar222 * fVar150 * auVar55._8_4_;
  auVar137._12_4_ = auVar52._12_4_ + auVar56._12_4_ * fVar222 * fVar150 * auVar55._12_4_;
  auVar52 = vsubps_avx(auVar34,auVar137);
  auVar53 = vaddps_avx512vl(auVar35,auVar43);
  auVar76._0_4_ = fVar217 + auVar137._0_4_;
  auVar76._4_4_ = fVar218 + auVar137._4_4_;
  auVar76._8_4_ = fVar143 + auVar137._8_4_;
  auVar76._12_4_ = fVar149 + auVar137._12_4_;
  auVar55 = vshufps_avx512vl(auVar36,auVar36,0xff);
  auVar187._0_4_ = auVar177._0_4_ * auVar55._0_4_;
  auVar187._4_4_ = auVar177._4_4_ * auVar55._4_4_;
  auVar187._8_4_ = auVar177._8_4_ * auVar55._8_4_;
  auVar187._12_4_ = auVar177._12_4_ * auVar55._12_4_;
  auVar54 = vsubps_avx512vl(auVar36,auVar187);
  auVar56 = vshufps_avx512vl(auVar48,auVar48,0xff);
  auVar43 = vmulps_avx512vl(auVar56,auVar177);
  auVar79._0_4_ = auVar43._0_4_ + auVar55._0_4_ * fVar206 * auVar50._0_4_ * fVar170;
  auVar79._4_4_ = auVar43._4_4_ + auVar55._4_4_ * fVar206 * auVar50._4_4_ * fVar170;
  auVar79._8_4_ = auVar43._8_4_ + auVar55._8_4_ * fVar206 * auVar50._8_4_ * fVar170;
  auVar79._12_4_ = auVar43._12_4_ + auVar55._12_4_ * fVar206 * auVar50._12_4_ * fVar170;
  auVar50 = vsubps_avx512vl(auVar48,auVar79);
  auVar34 = vaddps_avx512vl(auVar36,auVar187);
  auVar55 = vaddps_avx512vl(auVar48,auVar79);
  auVar52 = vmulps_avx512vl(auVar52,auVar47);
  auVar171._0_4_ = auVar44._0_4_ + auVar52._0_4_;
  auVar171._4_4_ = auVar44._4_4_ + auVar52._4_4_;
  auVar171._8_4_ = auVar44._8_4_ + auVar52._8_4_;
  auVar171._12_4_ = auVar44._12_4_ + auVar52._12_4_;
  auVar52 = vmulps_avx512vl(auVar50,auVar47);
  auVar43 = vsubps_avx(auVar54,auVar52);
  auVar52 = vmulps_avx512vl(auVar76,auVar47);
  auVar48 = vaddps_avx512vl(auVar53,auVar52);
  auVar52 = vmulps_avx512vl(auVar55,auVar47);
  auVar35 = vsubps_avx512vl(auVar34,auVar52);
  auVar52 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (*(long *)(p_Var8 + lVar26 + 0x38) +
                        *(long *)(p_Var8 + lVar26 + 0x48) * uVar21),auVar58,auVar47);
  auVar50 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (*(long *)(p_Var8 + lVar26 + 0x38) +
                        *(long *)(p_Var8 + lVar26 + 0x48) * lVar25),auVar45,auVar47);
  auVar55 = vfmadd132ps_avx512vl(*(undefined1 (*) [16])(lVar22 + uVar21 * lVar11),auVar40,auVar47);
  auVar37 = vfnmadd132ps_avx512vl(*(undefined1 (*) [16])(lVar22 + lVar11 * lVar25),auVar41,auVar47);
  auVar38 = vmulps_avx512vl(auVar45,auVar90._0_16_);
  auVar38 = vfmadd231ps_avx512vl(auVar38,auVar50,auVar90._0_16_);
  auVar56 = vxorps_avx512vl(auVar56,auVar56);
  auVar56 = vfmadd213ps_avx512vl(auVar56,auVar52,auVar38);
  auVar39 = vaddps_avx512vl(auVar58,auVar56);
  auVar56 = vfmadd231ps_avx512vl(auVar38,auVar52,auVar59);
  auVar38 = vfnmadd231ps_avx512vl(auVar56,auVar58,auVar59);
  auVar56 = vmulps_avx512vl(auVar41,auVar90._0_16_);
  auVar56 = vfmadd231ps_avx512vl(auVar56,auVar37,auVar90._0_16_);
  auVar36 = vxorps_avx512vl(auVar36,auVar36);
  auVar36 = vfmadd213ps_avx512vl(auVar36,auVar55,auVar56);
  auVar57 = vaddps_avx512vl(auVar40,auVar36);
  auVar56 = vfmadd231ps_avx512vl(auVar56,auVar55,auVar59);
  auVar56 = vfnmadd231ps_avx512vl(auVar56,auVar40,auVar59);
  auVar36 = vxorps_avx512vl(auVar36,auVar36);
  auVar36 = vfmadd213ps_avx512vl(auVar36,auVar50,auVar45);
  auVar36 = vfmadd231ps_avx512vl(auVar36,auVar52,auVar90._0_16_);
  auVar36 = vfmadd231ps_avx512vl(auVar36,auVar58,auVar90._0_16_);
  auVar45 = vmulps_avx512vl(auVar45,auVar59);
  auVar50 = vfnmadd231ps_avx512vl(auVar45,auVar59,auVar50);
  auVar52 = vfmadd231ps_avx512vl(auVar50,auVar90._0_16_,auVar52);
  auVar58 = vfnmadd231ps_avx512vl(auVar52,auVar90._0_16_,auVar58);
  auVar52 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar37,auVar41);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar55,auVar90._0_16_);
  auVar45 = vfmadd231ps_avx512vl(auVar52,auVar40,auVar90._0_16_);
  auVar52 = vmulps_avx512vl(auVar41,auVar59);
  auVar52 = vfnmadd231ps_avx512vl(auVar52,auVar59,auVar37);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar90._0_16_,auVar55);
  auVar40 = vfnmadd231ps_avx512vl(auVar52,auVar90._0_16_,auVar40);
  auVar52 = vshufps_avx(auVar38,auVar38,0xc9);
  auVar50 = vshufps_avx512vl(auVar57,auVar57,0xc9);
  fVar222 = auVar38._0_4_;
  auVar238._0_4_ = fVar222 * auVar50._0_4_;
  fVar206 = auVar38._4_4_;
  auVar238._4_4_ = fVar206 * auVar50._4_4_;
  fVar217 = auVar38._8_4_;
  auVar238._8_4_ = fVar217 * auVar50._8_4_;
  fVar218 = auVar38._12_4_;
  auVar238._12_4_ = fVar218 * auVar50._12_4_;
  auVar50 = vfmsub231ps_avx512vl(auVar238,auVar52,auVar57);
  auVar55 = vshufps_avx(auVar50,auVar50,0xc9);
  auVar50 = vshufps_avx512vl(auVar56,auVar56,0xc9);
  auVar245._0_4_ = fVar222 * auVar50._0_4_;
  auVar245._4_4_ = fVar206 * auVar50._4_4_;
  auVar245._8_4_ = fVar217 * auVar50._8_4_;
  auVar245._12_4_ = fVar218 * auVar50._12_4_;
  auVar52 = vfmsub231ps_avx512vl(auVar245,auVar52,auVar56);
  auVar56 = vshufps_avx(auVar52,auVar52,0xc9);
  auVar50 = vshufps_avx(auVar58,auVar58,0xc9);
  auVar52 = vshufps_avx512vl(auVar45,auVar45,0xc9);
  auVar52 = vmulps_avx512vl(auVar58,auVar52);
  auVar52 = vfmsub231ps_avx512vl(auVar52,auVar50,auVar45);
  auVar45 = vshufps_avx512vl(auVar52,auVar52,0xc9);
  auVar41 = vshufps_avx512vl(auVar40,auVar40,0xc9);
  auVar52 = vdpps_avx(auVar55,auVar55,0x7f);
  auVar41 = vmulps_avx512vl(auVar58,auVar41);
  auVar50 = vfmsub231ps_avx512vl(auVar41,auVar50,auVar40);
  auVar40 = vshufps_avx512vl(auVar50,auVar50,0xc9);
  auVar108._16_16_ = auVar90._16_16_;
  auVar108._0_16_ = auVar90._0_16_;
  auVar92._4_28_ = auVar108._4_28_;
  auVar92._0_4_ = auVar52._0_4_;
  auVar50 = vrsqrt14ss_avx512f(auVar90._0_16_,auVar92._0_16_);
  auVar41 = vmulss_avx512f(auVar50,ZEXT416(0x3fc00000));
  auVar37 = vmulss_avx512f(auVar52,ZEXT416(0x3f000000));
  auVar37 = vmulss_avx512f(auVar37,auVar50);
  auVar50 = vmulss_avx512f(auVar50,auVar50);
  auVar50 = vmulss_avx512f(auVar37,auVar50);
  auVar50 = vsubss_avx512f(auVar41,auVar50);
  auVar41 = vbroadcastss_avx512vl(auVar50);
  auVar37 = vmulps_avx512vl(auVar55,auVar41);
  auVar50 = vdpps_avx(auVar55,auVar56,0x7f);
  auVar57 = vbroadcastss_avx512vl(auVar52);
  auVar56 = vmulps_avx512vl(auVar57,auVar56);
  fVar150 = auVar50._0_4_;
  auVar85._0_4_ = auVar55._0_4_ * fVar150;
  auVar85._4_4_ = auVar55._4_4_ * fVar150;
  auVar85._8_4_ = auVar55._8_4_ * fVar150;
  auVar85._12_4_ = auVar55._12_4_ * fVar150;
  auVar50 = vsubps_avx(auVar56,auVar85);
  auVar55 = vrcp14ss_avx512f(auVar90._0_16_,auVar92._0_16_);
  auVar52 = vfnmadd213ss_avx512f(auVar52,auVar55,ZEXT416(0x40000000));
  fVar150 = auVar55._0_4_ * auVar52._0_4_;
  auVar52 = vdpps_avx(auVar45,auVar45,0x7f);
  auVar67._0_4_ = fVar150 * auVar50._0_4_;
  auVar67._4_4_ = fVar150 * auVar50._4_4_;
  auVar67._8_4_ = fVar150 * auVar50._8_4_;
  auVar67._12_4_ = fVar150 * auVar50._12_4_;
  auVar55 = vmulps_avx512vl(auVar41,auVar67);
  auVar93._16_16_ = auVar90._16_16_;
  auVar93._0_16_ = auVar90._0_16_;
  auVar94._4_28_ = auVar93._4_28_;
  auVar94._0_4_ = auVar52._0_4_;
  auVar50 = vrsqrt14ss_avx512f(auVar90._0_16_,auVar94._0_16_);
  auVar56 = vmulss_avx512f(auVar50,ZEXT416(0x3fc00000));
  auVar57 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar261 = ZEXT1664(auVar57);
  auVar41 = vmulss_avx512f(auVar52,ZEXT416(0x3f000000));
  auVar260 = ZEXT464(0x3f800000);
  auVar41 = vmulss_avx512f(auVar41,auVar50);
  auVar50 = vmulss_avx512f(auVar41,ZEXT416((uint)(auVar50._0_4_ * auVar50._0_4_)));
  fVar170 = auVar56._0_4_ - auVar50._0_4_;
  auVar246._0_4_ = auVar45._0_4_ * fVar170;
  auVar246._4_4_ = auVar45._4_4_ * fVar170;
  auVar246._8_4_ = auVar45._8_4_ * fVar170;
  auVar246._12_4_ = auVar45._12_4_ * fVar170;
  auVar50 = vdpps_avx(auVar45,auVar40,0x7f);
  auVar56 = vbroadcastss_avx512vl(auVar52);
  auVar56 = vmulps_avx512vl(auVar56,auVar40);
  fVar150 = auVar50._0_4_;
  auVar77._0_4_ = auVar45._0_4_ * fVar150;
  auVar77._4_4_ = auVar45._4_4_ * fVar150;
  auVar77._8_4_ = auVar45._8_4_ * fVar150;
  auVar77._12_4_ = auVar45._12_4_ * fVar150;
  auVar50 = vsubps_avx(auVar56,auVar77);
  auVar56 = vrcp14ss_avx512f(auVar90._0_16_,auVar94._0_16_);
  auVar52 = vfnmadd213ss_avx512f(auVar52,auVar56,ZEXT416(0x40000000));
  fVar150 = auVar52._0_4_ * auVar56._0_4_;
  auVar56 = vshufps_avx512vl(auVar39,auVar39,0xff);
  auVar45 = vmulps_avx512vl(auVar56,auVar37);
  auVar40 = vsubps_avx512vl(auVar39,auVar45);
  auVar52 = vshufps_avx(auVar38,auVar38,0xff);
  auVar52 = vmulps_avx512vl(auVar52,auVar37);
  auVar68._0_4_ = auVar52._0_4_ + auVar56._0_4_ * auVar55._0_4_;
  auVar68._4_4_ = auVar52._4_4_ + auVar56._4_4_ * auVar55._4_4_;
  auVar68._8_4_ = auVar52._8_4_ + auVar56._8_4_ * auVar55._8_4_;
  auVar68._12_4_ = auVar52._12_4_ + auVar56._12_4_ * auVar55._12_4_;
  auVar52 = vsubps_avx(auVar38,auVar68);
  auVar55 = vaddps_avx512vl(auVar39,auVar45);
  auVar69._0_4_ = fVar222 + auVar68._0_4_;
  auVar69._4_4_ = fVar206 + auVar68._4_4_;
  auVar69._8_4_ = fVar217 + auVar68._8_4_;
  auVar69._12_4_ = fVar218 + auVar68._12_4_;
  auVar56 = vshufps_avx512vl(auVar36,auVar36,0xff);
  auVar233._0_4_ = auVar56._0_4_ * auVar246._0_4_;
  auVar233._4_4_ = auVar56._4_4_ * auVar246._4_4_;
  auVar233._8_4_ = auVar56._8_4_ * auVar246._8_4_;
  auVar233._12_4_ = auVar56._12_4_ * auVar246._12_4_;
  auVar45 = vsubps_avx512vl(auVar36,auVar233);
  auVar41 = vshufps_avx512vl(auVar58,auVar58,0xff);
  auVar41 = vmulps_avx512vl(auVar41,auVar246);
  auVar151._0_4_ = auVar41._0_4_ + auVar56._0_4_ * fVar170 * auVar50._0_4_ * fVar150;
  auVar151._4_4_ = auVar41._4_4_ + auVar56._4_4_ * fVar170 * auVar50._4_4_ * fVar150;
  auVar151._8_4_ = auVar41._8_4_ + auVar56._8_4_ * fVar170 * auVar50._8_4_ * fVar150;
  auVar151._12_4_ = auVar41._12_4_ + auVar56._12_4_ * fVar170 * auVar50._12_4_ * fVar150;
  auVar50 = vsubps_avx(auVar58,auVar151);
  auVar56 = vaddps_avx512vl(auVar36,auVar233);
  auVar80._0_4_ = auVar58._0_4_ + auVar151._0_4_;
  auVar80._4_4_ = auVar58._4_4_ + auVar151._4_4_;
  auVar80._8_4_ = auVar58._8_4_ + auVar151._8_4_;
  auVar80._12_4_ = auVar58._12_4_ + auVar151._12_4_;
  auVar52 = vmulps_avx512vl(auVar52,auVar47);
  auVar84._0_4_ = auVar40._0_4_ + auVar52._0_4_;
  auVar84._4_4_ = auVar40._4_4_ + auVar52._4_4_;
  auVar84._8_4_ = auVar40._8_4_ + auVar52._8_4_;
  auVar84._12_4_ = auVar40._12_4_ + auVar52._12_4_;
  auVar52 = vmulps_avx512vl(auVar50,auVar47);
  auVar52 = vsubps_avx(auVar45,auVar52);
  auVar50 = vmulps_avx512vl(auVar69,auVar47);
  auVar70._0_4_ = auVar55._0_4_ + auVar50._0_4_;
  auVar70._4_4_ = auVar55._4_4_ + auVar50._4_4_;
  auVar70._8_4_ = auVar55._8_4_ + auVar50._8_4_;
  auVar70._12_4_ = auVar55._12_4_ + auVar50._12_4_;
  auVar50 = vmulps_avx512vl(auVar80,auVar47);
  auVar50 = vsubps_avx(auVar56,auVar50);
  auVar58 = vbroadcastss_avx512vl(auVar46);
  auVar41 = vsubss_avx512f(ZEXT416(0x3f800000),auVar46);
  auVar247._0_4_ = auVar41._0_4_;
  auVar247._4_4_ = auVar247._0_4_;
  auVar247._8_4_ = auVar247._0_4_;
  auVar247._12_4_ = auVar247._0_4_;
  auVar40 = vmulps_avx512vl(auVar58,auVar40);
  auVar41 = vmulps_avx512vl(auVar58,auVar84);
  auVar52 = vmulps_avx512vl(auVar58,auVar52);
  auVar239._0_4_ = auVar58._0_4_ * auVar45._0_4_;
  auVar239._4_4_ = auVar58._4_4_ * auVar45._4_4_;
  auVar239._8_4_ = auVar58._8_4_ * auVar45._8_4_;
  auVar239._12_4_ = auVar58._12_4_ * auVar45._12_4_;
  auVar39 = vfmadd231ps_avx512vl(auVar40,auVar247,auVar44);
  auVar59 = vfmadd231ps_avx512vl(auVar41,auVar247,auVar171);
  auVar60 = vfmadd231ps_avx512vl(auVar52,auVar247,auVar43);
  auVar44 = vfmadd231ps_fma(auVar239,auVar247,auVar54);
  auVar52 = vmulps_avx512vl(auVar58,auVar55);
  auVar55 = vmulps_avx512vl(auVar58,auVar70);
  auVar50 = vmulps_avx512vl(auVar58,auVar50);
  auVar234._0_4_ = auVar58._0_4_ * auVar56._0_4_;
  auVar234._4_4_ = auVar58._4_4_ * auVar56._4_4_;
  auVar234._8_4_ = auVar58._8_4_ * auVar56._8_4_;
  auVar234._12_4_ = auVar58._12_4_ * auVar56._12_4_;
  auVar61 = vfmadd231ps_avx512vl(auVar52,auVar247,auVar53);
  auVar62 = vfmadd231ps_avx512vl(auVar55,auVar247,auVar48);
  auVar63 = vfmadd231ps_avx512vl(auVar50,auVar247,auVar35);
  auVar46 = vfmadd231ps_fma(auVar234,auVar247,auVar34);
  auVar52 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar52 = vinsertps_avx(auVar52,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  auVar64 = vsubps_avx512vl(auVar39,auVar52);
  uVar125 = auVar64._0_4_;
  auVar71._4_4_ = uVar125;
  auVar71._0_4_ = uVar125;
  auVar71._8_4_ = uVar125;
  auVar71._12_4_ = uVar125;
  auVar50 = vshufps_avx(auVar64,auVar64,0x55);
  auVar55 = vshufps_avx(auVar64,auVar64,0xaa);
  aVar2 = pre->ray_space[k].vx.field_0;
  aVar3 = pre->ray_space[k].vy.field_0;
  fVar150 = pre->ray_space[k].vz.field_0.m128[0];
  fVar170 = pre->ray_space[k].vz.field_0.m128[1];
  fVar222 = pre->ray_space[k].vz.field_0.m128[2];
  fVar206 = pre->ray_space[k].vz.field_0.m128[3];
  auVar66._0_4_ = fVar150 * auVar55._0_4_;
  auVar66._4_4_ = fVar170 * auVar55._4_4_;
  auVar66._8_4_ = fVar222 * auVar55._8_4_;
  auVar66._12_4_ = fVar206 * auVar55._12_4_;
  auVar50 = vfmadd231ps_fma(auVar66,(undefined1  [16])aVar3,auVar50);
  auVar47 = vfmadd231ps_fma(auVar50,(undefined1  [16])aVar2,auVar71);
  auVar65 = vsubps_avx512vl(auVar59,auVar52);
  uVar125 = auVar65._0_4_;
  auVar75._4_4_ = uVar125;
  auVar75._0_4_ = uVar125;
  auVar75._8_4_ = uVar125;
  auVar75._12_4_ = uVar125;
  auVar50 = vshufps_avx(auVar65,auVar65,0x55);
  auVar55 = vshufps_avx(auVar65,auVar65,0xaa);
  auVar72._0_4_ = fVar150 * auVar55._0_4_;
  auVar72._4_4_ = fVar170 * auVar55._4_4_;
  auVar72._8_4_ = fVar222 * auVar55._8_4_;
  auVar72._12_4_ = fVar206 * auVar55._12_4_;
  auVar50 = vfmadd231ps_fma(auVar72,(undefined1  [16])aVar3,auVar50);
  auVar48 = vfmadd231ps_fma(auVar50,(undefined1  [16])aVar2,auVar75);
  auVar66 = vsubps_avx512vl(auVar60,auVar52);
  uVar125 = auVar66._0_4_;
  auVar73._4_4_ = uVar125;
  auVar73._0_4_ = uVar125;
  auVar73._8_4_ = uVar125;
  auVar73._12_4_ = uVar125;
  auVar50 = vshufps_avx(auVar66,auVar66,0x55);
  auVar55 = vshufps_avx(auVar66,auVar66,0xaa);
  auVar178._0_4_ = auVar55._0_4_ * fVar150;
  auVar178._4_4_ = auVar55._4_4_ * fVar170;
  auVar178._8_4_ = auVar55._8_4_ * fVar222;
  auVar178._12_4_ = auVar55._12_4_ * fVar206;
  auVar50 = vfmadd231ps_fma(auVar178,(undefined1  [16])aVar3,auVar50);
  auVar53 = vfmadd231ps_fma(auVar50,(undefined1  [16])aVar2,auVar73);
  auVar40 = vsubps_avx(auVar44,auVar52);
  uVar125 = auVar40._0_4_;
  auVar74._4_4_ = uVar125;
  auVar74._0_4_ = uVar125;
  auVar74._8_4_ = uVar125;
  auVar74._12_4_ = uVar125;
  auVar50 = vshufps_avx(auVar40,auVar40,0x55);
  auVar55 = vshufps_avx(auVar40,auVar40,0xaa);
  auVar188._0_4_ = auVar55._0_4_ * fVar150;
  auVar188._4_4_ = auVar55._4_4_ * fVar170;
  auVar188._8_4_ = auVar55._8_4_ * fVar222;
  auVar188._12_4_ = auVar55._12_4_ * fVar206;
  auVar50 = vfmadd231ps_fma(auVar188,(undefined1  [16])aVar3,auVar50);
  auVar54 = vfmadd231ps_fma(auVar50,(undefined1  [16])aVar2,auVar74);
  auVar67 = vsubps_avx512vl(auVar61,auVar52);
  uVar125 = auVar67._0_4_;
  auVar81._4_4_ = uVar125;
  auVar81._0_4_ = uVar125;
  auVar81._8_4_ = uVar125;
  auVar81._12_4_ = uVar125;
  auVar50 = vshufps_avx(auVar67,auVar67,0x55);
  auVar55 = vshufps_avx(auVar67,auVar67,0xaa);
  auVar199._0_4_ = auVar55._0_4_ * fVar150;
  auVar199._4_4_ = auVar55._4_4_ * fVar170;
  auVar199._8_4_ = auVar55._8_4_ * fVar222;
  auVar199._12_4_ = auVar55._12_4_ * fVar206;
  auVar50 = vfmadd231ps_fma(auVar199,(undefined1  [16])aVar3,auVar50);
  auVar34 = vfmadd231ps_fma(auVar50,(undefined1  [16])aVar2,auVar81);
  auVar68 = vsubps_avx512vl(auVar62,auVar52);
  uVar125 = auVar68._0_4_;
  auVar86._4_4_ = uVar125;
  auVar86._0_4_ = uVar125;
  auVar86._8_4_ = uVar125;
  auVar86._12_4_ = uVar125;
  auVar50 = vshufps_avx(auVar68,auVar68,0x55);
  auVar55 = vshufps_avx(auVar68,auVar68,0xaa);
  auVar207._0_4_ = auVar55._0_4_ * fVar150;
  auVar207._4_4_ = auVar55._4_4_ * fVar170;
  auVar207._8_4_ = auVar55._8_4_ * fVar222;
  auVar207._12_4_ = auVar55._12_4_ * fVar206;
  auVar50 = vfmadd231ps_fma(auVar207,(undefined1  [16])aVar3,auVar50);
  auVar35 = vfmadd231ps_fma(auVar50,(undefined1  [16])aVar2,auVar86);
  auVar69 = vsubps_avx512vl(auVar63,auVar52);
  uVar125 = auVar69._0_4_;
  auVar82._4_4_ = uVar125;
  auVar82._0_4_ = uVar125;
  auVar82._8_4_ = uVar125;
  auVar82._12_4_ = uVar125;
  auVar50 = vshufps_avx(auVar69,auVar69,0x55);
  auVar55 = vshufps_avx(auVar69,auVar69,0xaa);
  auVar224._0_4_ = auVar55._0_4_ * fVar150;
  auVar224._4_4_ = auVar55._4_4_ * fVar170;
  auVar224._8_4_ = auVar55._8_4_ * fVar222;
  auVar224._12_4_ = auVar55._12_4_ * fVar206;
  auVar50 = vfmadd231ps_fma(auVar224,(undefined1  [16])aVar3,auVar50);
  auVar37 = vfmadd231ps_fma(auVar50,(undefined1  [16])aVar2,auVar82);
  auVar41 = vsubps_avx(auVar46,auVar52);
  uVar125 = auVar41._0_4_;
  auVar87._4_4_ = uVar125;
  auVar87._0_4_ = uVar125;
  auVar87._8_4_ = uVar125;
  auVar87._12_4_ = uVar125;
  auVar52 = vshufps_avx(auVar41,auVar41,0x55);
  auVar50 = vshufps_avx(auVar41,auVar41,0xaa);
  auVar163._0_4_ = fVar150 * auVar50._0_4_;
  auVar163._4_4_ = fVar170 * auVar50._4_4_;
  auVar163._8_4_ = fVar222 * auVar50._8_4_;
  auVar163._12_4_ = fVar206 * auVar50._12_4_;
  auVar52 = vfmadd231ps_fma(auVar163,(undefined1  [16])aVar3,auVar52);
  auVar38 = vfmadd231ps_fma(auVar52,(undefined1  [16])aVar2,auVar87);
  auVar55 = vmovlhps_avx(auVar47,auVar34);
  auVar56 = vmovlhps_avx(auVar48,auVar35);
  auVar58 = vmovlhps_avx(auVar53,auVar37);
  auVar43 = vmovlhps_avx512f(auVar54,auVar38);
  auVar50 = vminps_avx(auVar55,auVar56);
  auVar52 = vmaxps_avx(auVar55,auVar56);
  auVar45 = vminps_avx512vl(auVar58,auVar43);
  auVar50 = vminps_avx(auVar50,auVar45);
  auVar45 = vmaxps_avx512vl(auVar58,auVar43);
  auVar52 = vmaxps_avx(auVar52,auVar45);
  auVar45 = vshufpd_avx(auVar50,auVar50,3);
  auVar50 = vminps_avx(auVar50,auVar45);
  auVar45 = vshufpd_avx(auVar52,auVar52,3);
  auVar52 = vmaxps_avx(auVar52,auVar45);
  auVar50 = vandps_avx512vl(auVar50,auVar259._0_16_);
  auVar52 = vandps_avx512vl(auVar52,auVar259._0_16_);
  auVar52 = vmaxps_avx(auVar50,auVar52);
  auVar50 = vmovshdup_avx(auVar52);
  auVar52 = vmaxss_avx(auVar50,auVar52);
  lVar25 = uVar27 + 0xf;
  fVar170 = auVar52._0_4_ * 9.536743e-07;
  auVar70 = vmovddup_avx512vl(auVar47);
  auVar48 = vmovddup_avx512vl(auVar48);
  auVar179._0_8_ = auVar53._0_8_;
  auVar179._8_8_ = auVar179._0_8_;
  auVar189._0_8_ = auVar54._0_8_;
  auVar189._8_8_ = auVar189._0_8_;
  auVar89 = vbroadcastss_avx512vl(ZEXT416((uint)fVar170));
  auVar52 = vxorps_avx512vl(auVar89._0_16_,auVar57);
  auVar90 = vbroadcastss_avx512vl(auVar52);
  bVar28 = false;
  uVar21 = 0;
  fVar150 = *(float *)(ray + k * 4 + 0x30);
  auVar52 = vsubps_avx(auVar56,auVar55);
  auVar50 = vsubps_avx(auVar58,auVar56);
  auVar53 = vsubps_avx512vl(auVar43,auVar58);
  auVar54 = vsubps_avx512vl(auVar61,auVar39);
  auVar57 = vsubps_avx512vl(auVar62,auVar59);
  auVar71 = vsubps_avx512vl(auVar63,auVar60);
  auVar45 = vsubps_avx(auVar46,auVar44);
  auVar72 = vpbroadcastd_avx512vl();
  auVar47 = ZEXT816(0x3f80000000000000);
  auVar36 = auVar47;
LAB_0192ff37:
  auVar87 = vshufps_avx(auVar36,auVar36,0x50);
  auVar240._8_4_ = 0x3f800000;
  auVar240._0_8_ = 0x3f8000003f800000;
  auVar240._12_4_ = 0x3f800000;
  auVar244._16_4_ = 0x3f800000;
  auVar244._0_16_ = auVar240;
  auVar244._20_4_ = 0x3f800000;
  auVar244._24_4_ = 0x3f800000;
  auVar244._28_4_ = 0x3f800000;
  auVar137 = vsubps_avx(auVar240,auVar87);
  fVar222 = auVar87._0_4_;
  fVar143 = auVar34._0_4_;
  auVar144._0_4_ = fVar143 * fVar222;
  fVar206 = auVar87._4_4_;
  fVar149 = auVar34._4_4_;
  auVar144._4_4_ = fVar149 * fVar206;
  fVar217 = auVar87._8_4_;
  auVar144._8_4_ = fVar143 * fVar217;
  fVar218 = auVar87._12_4_;
  auVar144._12_4_ = fVar149 * fVar218;
  fVar198 = auVar35._0_4_;
  auVar152._0_4_ = fVar198 * fVar222;
  fVar204 = auVar35._4_4_;
  auVar152._4_4_ = fVar204 * fVar206;
  auVar152._8_4_ = fVar198 * fVar217;
  auVar152._12_4_ = fVar204 * fVar218;
  fVar205 = auVar37._0_4_;
  auVar164._0_4_ = fVar205 * fVar222;
  fVar216 = auVar37._4_4_;
  auVar164._4_4_ = fVar216 * fVar206;
  auVar164._8_4_ = fVar205 * fVar217;
  auVar164._12_4_ = fVar216 * fVar218;
  fVar223 = auVar38._0_4_;
  auVar131._0_4_ = fVar223 * fVar222;
  fVar232 = auVar38._4_4_;
  auVar131._4_4_ = fVar232 * fVar206;
  auVar131._8_4_ = fVar223 * fVar217;
  auVar131._12_4_ = fVar232 * fVar218;
  auVar73 = vfmadd231ps_avx512vl(auVar144,auVar137,auVar70);
  auVar74 = vfmadd231ps_avx512vl(auVar152,auVar137,auVar48);
  auVar75 = vfmadd231ps_fma(auVar164,auVar137,auVar179);
  auVar137 = vfmadd231ps_fma(auVar131,auVar189,auVar137);
  auVar87 = vmovshdup_avx(auVar47);
  fVar206 = auVar47._0_4_;
  fVar222 = (auVar87._0_4_ - fVar206) * 0.04761905;
  auVar148._4_4_ = fVar206;
  auVar148._0_4_ = fVar206;
  auVar148._8_4_ = fVar206;
  auVar148._12_4_ = fVar206;
  auVar148._16_4_ = fVar206;
  auVar148._20_4_ = fVar206;
  auVar148._24_4_ = fVar206;
  auVar148._28_4_ = fVar206;
  auVar99._0_8_ = auVar87._0_8_;
  auVar99._8_8_ = auVar99._0_8_;
  auVar99._16_8_ = auVar99._0_8_;
  auVar99._24_8_ = auVar99._0_8_;
  auVar109 = vsubps_avx(auVar99,auVar148);
  uVar125 = auVar73._0_4_;
  auVar111._4_4_ = uVar125;
  auVar111._0_4_ = uVar125;
  auVar111._8_4_ = uVar125;
  auVar111._12_4_ = uVar125;
  auVar111._16_4_ = uVar125;
  auVar111._20_4_ = uVar125;
  auVar111._24_4_ = uVar125;
  auVar111._28_4_ = uVar125;
  auVar100._8_4_ = 1;
  auVar100._0_8_ = 0x100000001;
  auVar100._12_4_ = 1;
  auVar100._16_4_ = 1;
  auVar100._20_4_ = 1;
  auVar100._24_4_ = 1;
  auVar100._28_4_ = 1;
  auVar108 = ZEXT1632(auVar73);
  auVar106 = vpermps_avx2(auVar100,auVar108);
  auVar91 = vbroadcastss_avx512vl(auVar74);
  auVar107 = ZEXT1632(auVar74);
  auVar92 = vpermps_avx512vl(auVar100,auVar107);
  auVar93 = vbroadcastss_avx512vl(auVar75);
  auVar102 = ZEXT1632(auVar75);
  auVar94 = vpermps_avx512vl(auVar100,auVar102);
  auVar95 = vbroadcastss_avx512vl(auVar137);
  auVar105 = ZEXT1632(auVar137);
  auVar96 = vpermps_avx512vl(auVar100,auVar105);
  auVar202._4_4_ = fVar222;
  auVar202._0_4_ = fVar222;
  auVar202._8_4_ = fVar222;
  auVar202._12_4_ = fVar222;
  auVar202._16_4_ = fVar222;
  auVar202._20_4_ = fVar222;
  auVar202._24_4_ = fVar222;
  auVar202._28_4_ = fVar222;
  auVar103._8_4_ = 2;
  auVar103._0_8_ = 0x200000002;
  auVar103._12_4_ = 2;
  auVar103._16_4_ = 2;
  auVar103._20_4_ = 2;
  auVar103._24_4_ = 2;
  auVar103._28_4_ = 2;
  auVar97 = vpermps_avx512vl(auVar103,auVar108);
  auVar98 = vbroadcastss_avx512vl(ZEXT416(3));
  auVar99 = vpermps_avx512vl(auVar98,auVar108);
  auVar100 = vpermps_avx512vl(auVar103,auVar107);
  auVar101 = vpermps_avx512vl(auVar98,auVar107);
  auVar108 = vpermps_avx2(auVar103,auVar102);
  auVar102 = vpermps_avx512vl(auVar98,auVar102);
  auVar103 = vpermps_avx512vl(auVar103,auVar105);
  auVar104 = vpermps_avx512vl(auVar98,auVar105);
  auVar87 = vfmadd132ps_fma(auVar109,auVar148,_DAT_01f7b040);
  auVar109 = vsubps_avx(auVar244,ZEXT1632(auVar87));
  auVar98 = vmulps_avx512vl(auVar91,ZEXT1632(auVar87));
  auVar107 = ZEXT1632(auVar87);
  auVar105 = vmulps_avx512vl(auVar92,auVar107);
  auVar137 = vfmadd231ps_fma(auVar98,auVar109,auVar111);
  auVar75 = vfmadd231ps_fma(auVar105,auVar109,auVar106);
  auVar98 = vmulps_avx512vl(auVar93,auVar107);
  auVar105 = vmulps_avx512vl(auVar94,auVar107);
  auVar91 = vfmadd231ps_avx512vl(auVar98,auVar109,auVar91);
  auVar92 = vfmadd231ps_avx512vl(auVar105,auVar109,auVar92);
  auVar98 = vmulps_avx512vl(auVar95,auVar107);
  auVar111 = ZEXT1632(auVar87);
  auVar96 = vmulps_avx512vl(auVar96,auVar111);
  auVar93 = vfmadd231ps_avx512vl(auVar98,auVar109,auVar93);
  auVar94 = vfmadd231ps_avx512vl(auVar96,auVar109,auVar94);
  fVar217 = auVar87._0_4_;
  fVar218 = auVar87._4_4_;
  auVar96._4_4_ = fVar218 * auVar91._4_4_;
  auVar96._0_4_ = fVar217 * auVar91._0_4_;
  fVar219 = auVar87._8_4_;
  auVar96._8_4_ = fVar219 * auVar91._8_4_;
  fVar220 = auVar87._12_4_;
  auVar96._12_4_ = fVar220 * auVar91._12_4_;
  auVar96._16_4_ = auVar91._16_4_ * 0.0;
  auVar96._20_4_ = auVar91._20_4_ * 0.0;
  auVar96._24_4_ = auVar91._24_4_ * 0.0;
  auVar96._28_4_ = fVar206;
  auVar98._4_4_ = fVar218 * auVar92._4_4_;
  auVar98._0_4_ = fVar217 * auVar92._0_4_;
  auVar98._8_4_ = fVar219 * auVar92._8_4_;
  auVar98._12_4_ = fVar220 * auVar92._12_4_;
  auVar98._16_4_ = auVar92._16_4_ * 0.0;
  auVar98._20_4_ = auVar92._20_4_ * 0.0;
  auVar98._24_4_ = auVar92._24_4_ * 0.0;
  auVar98._28_4_ = auVar106._28_4_;
  auVar137 = vfmadd231ps_fma(auVar96,auVar109,ZEXT1632(auVar137));
  auVar75 = vfmadd231ps_fma(auVar98,auVar109,ZEXT1632(auVar75));
  auVar110._0_4_ = fVar217 * auVar93._0_4_;
  auVar110._4_4_ = fVar218 * auVar93._4_4_;
  auVar110._8_4_ = fVar219 * auVar93._8_4_;
  auVar110._12_4_ = fVar220 * auVar93._12_4_;
  auVar110._16_4_ = auVar93._16_4_ * 0.0;
  auVar110._20_4_ = auVar93._20_4_ * 0.0;
  auVar110._24_4_ = auVar93._24_4_ * 0.0;
  auVar110._28_4_ = 0;
  auVar105._4_4_ = fVar218 * auVar94._4_4_;
  auVar105._0_4_ = fVar217 * auVar94._0_4_;
  auVar105._8_4_ = fVar219 * auVar94._8_4_;
  auVar105._12_4_ = fVar220 * auVar94._12_4_;
  auVar105._16_4_ = auVar94._16_4_ * 0.0;
  auVar105._20_4_ = auVar94._20_4_ * 0.0;
  auVar105._24_4_ = auVar94._24_4_ * 0.0;
  auVar105._28_4_ = auVar93._28_4_;
  auVar73 = vfmadd231ps_fma(auVar110,auVar109,auVar91);
  auVar74 = vfmadd231ps_fma(auVar105,auVar109,auVar92);
  auVar107._28_4_ = auVar92._28_4_;
  auVar107._0_28_ =
       ZEXT1628(CONCAT412(fVar220 * auVar74._12_4_,
                          CONCAT48(fVar219 * auVar74._8_4_,
                                   CONCAT44(fVar218 * auVar74._4_4_,fVar217 * auVar74._0_4_))));
  auVar81 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar220 * auVar73._12_4_,
                                               CONCAT48(fVar219 * auVar73._8_4_,
                                                        CONCAT44(fVar218 * auVar73._4_4_,
                                                                 fVar217 * auVar73._0_4_)))),
                            auVar109,ZEXT1632(auVar137));
  auVar86 = vfmadd231ps_fma(auVar107,auVar109,ZEXT1632(auVar75));
  auVar106 = vsubps_avx(ZEXT1632(auVar73),ZEXT1632(auVar137));
  auVar91 = vsubps_avx(ZEXT1632(auVar74),ZEXT1632(auVar75));
  auVar92 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar106 = vmulps_avx512vl(auVar106,auVar92);
  auVar91 = vmulps_avx512vl(auVar91,auVar92);
  auVar158._0_4_ = fVar222 * auVar106._0_4_;
  auVar158._4_4_ = fVar222 * auVar106._4_4_;
  auVar158._8_4_ = fVar222 * auVar106._8_4_;
  auVar158._12_4_ = fVar222 * auVar106._12_4_;
  auVar158._16_4_ = fVar222 * auVar106._16_4_;
  auVar158._20_4_ = fVar222 * auVar106._20_4_;
  auVar158._24_4_ = fVar222 * auVar106._24_4_;
  auVar158._28_4_ = 0;
  auVar106 = vmulps_avx512vl(auVar202,auVar91);
  auVar75 = vxorps_avx512vl(auVar95._0_16_,auVar95._0_16_);
  auVar93 = vpermt2ps_avx512vl(ZEXT1632(auVar81),_DAT_01fb9fc0,ZEXT1632(auVar75));
  auVar94 = vpermt2ps_avx512vl(ZEXT1632(auVar86),_DAT_01fb9fc0,ZEXT1632(auVar75));
  auVar136._0_4_ = auVar158._0_4_ + auVar81._0_4_;
  auVar136._4_4_ = auVar158._4_4_ + auVar81._4_4_;
  auVar136._8_4_ = auVar158._8_4_ + auVar81._8_4_;
  auVar136._12_4_ = auVar158._12_4_ + auVar81._12_4_;
  auVar136._16_4_ = auVar158._16_4_ + 0.0;
  auVar136._20_4_ = auVar158._20_4_ + 0.0;
  auVar136._24_4_ = auVar158._24_4_ + 0.0;
  auVar136._28_4_ = 0;
  auVar110 = ZEXT1632(auVar75);
  auVar91 = vpermt2ps_avx512vl(auVar158,_DAT_01fb9fc0,auVar110);
  auVar96 = vaddps_avx512vl(ZEXT1632(auVar86),auVar106);
  auVar98 = vpermt2ps_avx512vl(auVar106,_DAT_01fb9fc0,auVar110);
  auVar106 = vsubps_avx(auVar93,auVar91);
  auVar98 = vsubps_avx512vl(auVar94,auVar98);
  auVar91 = vmulps_avx512vl(auVar100,auVar111);
  auVar105 = vmulps_avx512vl(auVar101,auVar111);
  auVar91 = vfmadd231ps_avx512vl(auVar91,auVar109,auVar97);
  auVar105 = vfmadd231ps_avx512vl(auVar105,auVar109,auVar99);
  auVar107 = vmulps_avx512vl(auVar108,auVar111);
  auVar95 = vmulps_avx512vl(auVar102,auVar111);
  auVar107 = vfmadd231ps_avx512vl(auVar107,auVar109,auVar100);
  auVar95 = vfmadd231ps_avx512vl(auVar95,auVar109,auVar101);
  auVar97 = vmulps_avx512vl(auVar103,auVar111);
  auVar99 = vmulps_avx512vl(auVar104,auVar111);
  auVar137 = vfmadd231ps_fma(auVar97,auVar109,auVar108);
  auVar108 = vfmadd231ps_avx512vl(auVar99,auVar109,auVar102);
  auVar97 = vmulps_avx512vl(auVar111,auVar107);
  auVar100 = ZEXT1632(auVar87);
  auVar99 = vmulps_avx512vl(auVar100,auVar95);
  auVar91 = vfmadd231ps_avx512vl(auVar97,auVar109,auVar91);
  auVar105 = vfmadd231ps_avx512vl(auVar99,auVar109,auVar105);
  auVar108 = vmulps_avx512vl(auVar100,auVar108);
  auVar107 = vfmadd231ps_avx512vl
                       (ZEXT1632(CONCAT412(fVar220 * auVar137._12_4_,
                                           CONCAT48(fVar219 * auVar137._8_4_,
                                                    CONCAT44(fVar218 * auVar137._4_4_,
                                                             fVar217 * auVar137._0_4_)))),auVar109,
                        auVar107);
  auVar108 = vfmadd231ps_avx512vl(auVar108,auVar109,auVar95);
  auVar95._4_4_ = fVar218 * auVar107._4_4_;
  auVar95._0_4_ = fVar217 * auVar107._0_4_;
  auVar95._8_4_ = fVar219 * auVar107._8_4_;
  auVar95._12_4_ = fVar220 * auVar107._12_4_;
  auVar95._16_4_ = auVar107._16_4_ * 0.0;
  auVar95._20_4_ = auVar107._20_4_ * 0.0;
  auVar95._24_4_ = auVar107._24_4_ * 0.0;
  auVar95._28_4_ = auVar102._28_4_;
  auVar97 = vmulps_avx512vl(auVar100,auVar108);
  auVar95 = vfmadd231ps_avx512vl(auVar95,auVar109,auVar91);
  auVar99 = vfmadd231ps_avx512vl(auVar97,auVar105,auVar109);
  auVar109 = vsubps_avx512vl(auVar107,auVar91);
  auVar91 = vsubps_avx512vl(auVar108,auVar105);
  auVar109 = vmulps_avx512vl(auVar109,auVar92);
  auVar91 = vmulps_avx512vl(auVar91,auVar92);
  fVar206 = fVar222 * auVar109._0_4_;
  fVar217 = fVar222 * auVar109._4_4_;
  auVar97._4_4_ = fVar217;
  auVar97._0_4_ = fVar206;
  fVar218 = fVar222 * auVar109._8_4_;
  auVar97._8_4_ = fVar218;
  fVar219 = fVar222 * auVar109._12_4_;
  auVar97._12_4_ = fVar219;
  fVar220 = fVar222 * auVar109._16_4_;
  auVar97._16_4_ = fVar220;
  fVar221 = fVar222 * auVar109._20_4_;
  auVar97._20_4_ = fVar221;
  fVar222 = fVar222 * auVar109._24_4_;
  auVar97._24_4_ = fVar222;
  auVar97._28_4_ = auVar109._28_4_;
  auVar91 = vmulps_avx512vl(auVar202,auVar91);
  auVar108 = vpermt2ps_avx512vl(auVar95,_DAT_01fb9fc0,auVar110);
  auVar92 = vpermt2ps_avx512vl(auVar99,_DAT_01fb9fc0,auVar110);
  auVar203._0_4_ = auVar95._0_4_ + fVar206;
  auVar203._4_4_ = auVar95._4_4_ + fVar217;
  auVar203._8_4_ = auVar95._8_4_ + fVar218;
  auVar203._12_4_ = auVar95._12_4_ + fVar219;
  auVar203._16_4_ = auVar95._16_4_ + fVar220;
  auVar203._20_4_ = auVar95._20_4_ + fVar221;
  auVar203._24_4_ = auVar95._24_4_ + fVar222;
  auVar203._28_4_ = auVar95._28_4_ + auVar109._28_4_;
  auVar109 = vpermt2ps_avx512vl(auVar97,_DAT_01fb9fc0,ZEXT1632(auVar75));
  auVar105 = vaddps_avx512vl(auVar99,auVar91);
  auVar107 = vpermt2ps_avx512vl(auVar91,_DAT_01fb9fc0,ZEXT1632(auVar75));
  auVar91 = vsubps_avx(auVar108,auVar109);
  auVar107 = vsubps_avx512vl(auVar92,auVar107);
  auVar253 = ZEXT3264(auVar107);
  auVar148 = ZEXT1632(auVar81);
  auVar109 = vsubps_avx512vl(auVar95,auVar148);
  auVar158 = ZEXT1632(auVar86);
  auVar97 = vsubps_avx512vl(auVar99,auVar158);
  auVar100 = vsubps_avx512vl(auVar108,auVar93);
  auVar109 = vaddps_avx512vl(auVar109,auVar100);
  auVar100 = vsubps_avx512vl(auVar92,auVar94);
  auVar97 = vaddps_avx512vl(auVar97,auVar100);
  auVar100 = vmulps_avx512vl(auVar158,auVar109);
  auVar100 = vfnmadd231ps_avx512vl(auVar100,auVar148,auVar97);
  auVar101 = vmulps_avx512vl(auVar96,auVar109);
  auVar101 = vfnmadd231ps_avx512vl(auVar101,auVar136,auVar97);
  auVar102 = vmulps_avx512vl(auVar98,auVar109);
  auVar102 = vfnmadd231ps_avx512vl(auVar102,auVar106,auVar97);
  auVar103 = vmulps_avx512vl(auVar94,auVar109);
  auVar103 = vfnmadd231ps_avx512vl(auVar103,auVar93,auVar97);
  auVar104 = vmulps_avx512vl(auVar99,auVar109);
  auVar104 = vfnmadd231ps_avx512vl(auVar104,auVar95,auVar97);
  auVar110 = vmulps_avx512vl(auVar105,auVar109);
  auVar110 = vfnmadd231ps_avx512vl(auVar110,auVar203,auVar97);
  auVar111 = vmulps_avx512vl(auVar107,auVar109);
  auVar111 = vfnmadd231ps_avx512vl(auVar111,auVar91,auVar97);
  auVar109 = vmulps_avx512vl(auVar92,auVar109);
  auVar109 = vfnmadd231ps_avx512vl(auVar109,auVar108,auVar97);
  auVar97 = vminps_avx512vl(auVar100,auVar101);
  auVar100 = vmaxps_avx512vl(auVar100,auVar101);
  auVar101 = vminps_avx512vl(auVar102,auVar103);
  auVar97 = vminps_avx512vl(auVar97,auVar101);
  auVar101 = vmaxps_avx512vl(auVar102,auVar103);
  auVar100 = vmaxps_avx512vl(auVar100,auVar101);
  auVar101 = vminps_avx512vl(auVar104,auVar110);
  auVar102 = vmaxps_avx512vl(auVar104,auVar110);
  auVar103 = vminps_avx512vl(auVar111,auVar109);
  auVar101 = vminps_avx512vl(auVar101,auVar103);
  auVar97 = vminps_avx512vl(auVar97,auVar101);
  auVar109 = vmaxps_avx512vl(auVar111,auVar109);
  auVar109 = vmaxps_avx512vl(auVar102,auVar109);
  auVar100 = vmaxps_avx512vl(auVar100,auVar109);
  uVar13 = vcmpps_avx512vl(auVar97,auVar89,2);
  uVar14 = vcmpps_avx512vl(auVar100,auVar90,5);
  bVar19 = (byte)uVar13 & (byte)uVar14 & 0x7f;
  auVar109 = _DAT_01fb9fe0;
  if (bVar19 == 0) {
    auVar47 = vxorps_avx512vl(auVar100._0_16_,auVar100._0_16_);
    auVar254 = ZEXT1664(auVar47);
    auVar47 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar258 = ZEXT1664(auVar47);
    auVar106 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar255 = ZEXT3264(auVar106);
    auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar256 = ZEXT1664(auVar47);
    auVar257 = ZEXT3264(_DAT_01fb9fe0);
  }
  else {
    auVar97 = vsubps_avx512vl(auVar93,auVar148);
    auVar100 = vsubps_avx512vl(auVar94,auVar158);
    auVar101 = vsubps_avx512vl(auVar108,auVar95);
    auVar97 = vaddps_avx512vl(auVar97,auVar101);
    auVar101 = vsubps_avx512vl(auVar92,auVar99);
    auVar100 = vaddps_avx512vl(auVar100,auVar101);
    auVar101 = vmulps_avx512vl(auVar158,auVar97);
    auVar101 = vfnmadd231ps_avx512vl(auVar101,auVar100,auVar148);
    auVar96 = vmulps_avx512vl(auVar96,auVar97);
    auVar96 = vfnmadd213ps_avx512vl(auVar136,auVar100,auVar96);
    auVar98 = vmulps_avx512vl(auVar98,auVar97);
    auVar98 = vfnmadd213ps_avx512vl(auVar106,auVar100,auVar98);
    auVar106 = vmulps_avx512vl(auVar94,auVar97);
    auVar93 = vfnmadd231ps_avx512vl(auVar106,auVar100,auVar93);
    auVar106 = vmulps_avx512vl(auVar99,auVar97);
    auVar94 = vfnmadd231ps_avx512vl(auVar106,auVar100,auVar95);
    auVar106 = vmulps_avx512vl(auVar105,auVar97);
    auVar105 = vfnmadd213ps_avx512vl(auVar203,auVar100,auVar106);
    auVar106 = vmulps_avx512vl(auVar107,auVar97);
    auVar107 = vfnmadd213ps_avx512vl(auVar91,auVar100,auVar106);
    auVar106 = vmulps_avx512vl(auVar92,auVar97);
    auVar95 = vfnmadd231ps_avx512vl(auVar106,auVar108,auVar100);
    auVar91 = vminps_avx(auVar101,auVar96);
    auVar106 = vmaxps_avx(auVar101,auVar96);
    auVar108 = vminps_avx(auVar98,auVar93);
    auVar108 = vminps_avx(auVar91,auVar108);
    auVar91 = vmaxps_avx(auVar98,auVar93);
    auVar106 = vmaxps_avx(auVar106,auVar91);
    auVar92 = vminps_avx(auVar94,auVar105);
    auVar91 = vmaxps_avx(auVar94,auVar105);
    auVar93 = vminps_avx(auVar107,auVar95);
    auVar92 = vminps_avx(auVar92,auVar93);
    auVar92 = vminps_avx(auVar108,auVar92);
    auVar108 = vmaxps_avx(auVar107,auVar95);
    auVar91 = vmaxps_avx(auVar91,auVar108);
    auVar106 = vmaxps_avx(auVar106,auVar91);
    uVar13 = vcmpps_avx512vl(auVar106,auVar90,5);
    uVar14 = vcmpps_avx512vl(auVar92,auVar89,2);
    bVar19 = bVar19 & (byte)uVar13 & (byte)uVar14;
    if (bVar19 != 0) {
      mask_stack[uVar21] = (uint)bVar19;
      BVar1 = (BBox1f)vmovlps_avx(auVar47);
      cu_stack[uVar21] = BVar1;
      BVar1 = (BBox1f)vmovlps_avx(auVar36);
      cv_stack[uVar21] = BVar1;
      uVar21 = (ulong)((int)uVar21 + 1);
    }
    auVar47 = vxorps_avx512vl(auVar97._0_16_,auVar97._0_16_);
    auVar254 = ZEXT1664(auVar47);
    auVar47 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar258 = ZEXT1664(auVar47);
    auVar106 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar255 = ZEXT3264(auVar106);
    auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar256 = ZEXT1664(auVar47);
    auVar257 = ZEXT3264(_DAT_01fb9fe0);
  }
LAB_01930497:
  do {
    do {
      do {
        in_ZMM28 = ZEXT464(0xff800000);
        auVar75 = in_ZMM28._0_16_;
        auVar87 = auVar254._0_16_;
        auVar137 = auVar258._0_16_;
        if ((int)uVar21 == 0) {
          if (bVar28) goto LAB_01931371;
          uVar125 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar18._4_4_ = uVar125;
          auVar18._0_4_ = uVar125;
          auVar18._8_4_ = uVar125;
          auVar18._12_4_ = uVar125;
          uVar13 = vcmpps_avx512vl(auVar51,auVar18,2);
          uVar27 = (ulong)((uint)uVar27 & (uint)lVar25 & (uint)uVar13);
          goto LAB_0192f3d2;
        }
        uVar20 = (int)uVar21 - 1;
        uVar5 = mask_stack[uVar20];
        auVar36._8_8_ = 0;
        auVar36._0_4_ = cv_stack[uVar20].lower;
        auVar36._4_4_ = cv_stack[uVar20].upper;
        uVar33 = 0;
        for (uVar24 = (ulong)uVar5; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
          uVar33 = uVar33 + 1;
        }
        uVar23 = uVar5 - 1 & uVar5;
        bVar31 = uVar23 == 0;
        mask_stack[uVar20] = uVar23;
        if (bVar31) {
          uVar21 = (ulong)uVar20;
        }
        auVar126._8_8_ = 0;
        auVar126._0_8_ = uVar33;
        auVar47 = vpunpcklqdq_avx(auVar126,ZEXT416((int)uVar33 + 1));
        auVar47 = vcvtqq2ps_avx512vl(auVar47);
        auVar47 = vmulps_avx512vl(auVar47,auVar256._0_16_);
        fVar222 = cu_stack[uVar20].upper;
        auVar15._4_4_ = fVar222;
        auVar15._0_4_ = fVar222;
        auVar15._8_4_ = fVar222;
        auVar15._12_4_ = fVar222;
        auVar73 = vmulps_avx512vl(auVar47,auVar15);
        auVar138._8_4_ = 0x3f800000;
        auVar138._0_8_ = 0x3f8000003f800000;
        auVar138._12_4_ = 0x3f800000;
        auVar47 = vsubps_avx(auVar138,auVar47);
        fVar222 = cu_stack[uVar20].lower;
        auVar16._4_4_ = fVar222;
        auVar16._0_4_ = fVar222;
        auVar16._8_4_ = fVar222;
        auVar16._12_4_ = fVar222;
        auVar47 = vfmadd231ps_avx512vl(auVar73,auVar47,auVar16);
        auVar73 = vmovshdup_avx(auVar47);
        fVar222 = auVar73._0_4_ - auVar47._0_4_;
        vucomiss_avx512f(ZEXT416((uint)fVar222));
        if (uVar5 == 0 || bVar31) goto LAB_0192ff37;
        auVar73 = vshufps_avx(auVar36,auVar36,0x50);
        vucomiss_avx512f(ZEXT416((uint)fVar222));
        auVar145._8_4_ = 0x3f800000;
        auVar145._0_8_ = 0x3f8000003f800000;
        auVar145._12_4_ = 0x3f800000;
        auVar74 = vsubps_avx(auVar145,auVar73);
        fVar206 = auVar73._0_4_;
        auVar153._0_4_ = fVar206 * fVar143;
        fVar217 = auVar73._4_4_;
        auVar153._4_4_ = fVar217 * fVar149;
        fVar218 = auVar73._8_4_;
        auVar153._8_4_ = fVar218 * fVar143;
        fVar219 = auVar73._12_4_;
        auVar153._12_4_ = fVar219 * fVar149;
        auVar165._0_4_ = fVar206 * fVar198;
        auVar165._4_4_ = fVar217 * fVar204;
        auVar165._8_4_ = fVar218 * fVar198;
        auVar165._12_4_ = fVar219 * fVar204;
        auVar172._0_4_ = fVar206 * fVar205;
        auVar172._4_4_ = fVar217 * fVar216;
        auVar172._8_4_ = fVar218 * fVar205;
        auVar172._12_4_ = fVar219 * fVar216;
        auVar139._0_4_ = fVar206 * fVar223;
        auVar139._4_4_ = fVar217 * fVar232;
        auVar139._8_4_ = fVar218 * fVar223;
        auVar139._12_4_ = fVar219 * fVar232;
        auVar73 = vfmadd231ps_fma(auVar153,auVar74,auVar70);
        auVar81 = vfmadd231ps_fma(auVar165,auVar74,auVar48);
        auVar86 = vfmadd231ps_fma(auVar172,auVar74,auVar179);
        auVar74 = vfmadd231ps_fma(auVar139,auVar74,auVar189);
        auVar101._16_16_ = auVar73;
        auVar101._0_16_ = auVar73;
        auVar102._16_16_ = auVar81;
        auVar102._0_16_ = auVar81;
        auVar169._16_16_ = auVar86;
        auVar169._0_16_ = auVar86;
        auVar106 = vpermps_avx512vl(auVar257._0_32_,ZEXT1632(auVar47));
        auVar109 = vsubps_avx(auVar102,auVar101);
        auVar81 = vfmadd213ps_fma(auVar109,auVar106,auVar101);
        auVar109 = vsubps_avx(auVar169,auVar102);
        auVar82 = vfmadd213ps_fma(auVar109,auVar106,auVar102);
        auVar73 = vsubps_avx(auVar74,auVar86);
        auVar104._16_16_ = auVar73;
        auVar104._0_16_ = auVar73;
        auVar73 = vfmadd213ps_fma(auVar104,auVar106,auVar169);
        auVar109 = vsubps_avx(ZEXT1632(auVar82),ZEXT1632(auVar81));
        auVar74 = vfmadd213ps_fma(auVar109,auVar106,ZEXT1632(auVar81));
        auVar109 = vsubps_avx(ZEXT1632(auVar73),ZEXT1632(auVar82));
        auVar73 = vfmadd213ps_fma(auVar109,auVar106,ZEXT1632(auVar82));
        auVar109 = vsubps_avx(ZEXT1632(auVar73),ZEXT1632(auVar74));
        auVar162 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar109,auVar106);
        auVar109 = vmulps_avx512vl(auVar109,auVar255._0_32_);
        auVar73 = vmulss_avx512f(ZEXT416((uint)fVar222),SUB6416(ZEXT464(0x3eaaaaab),0));
        fVar206 = auVar73._0_4_;
        auVar173._0_8_ =
             CONCAT44(auVar162._4_4_ + fVar206 * auVar109._4_4_,
                      auVar162._0_4_ + fVar206 * auVar109._0_4_);
        auVar173._8_4_ = auVar162._8_4_ + fVar206 * auVar109._8_4_;
        auVar173._12_4_ = auVar162._12_4_ + fVar206 * auVar109._12_4_;
        auVar154._0_4_ = fVar206 * auVar109._16_4_;
        auVar154._4_4_ = fVar206 * auVar109._20_4_;
        auVar154._8_4_ = fVar206 * auVar109._24_4_;
        auVar154._12_4_ = fVar206 * auVar109._28_4_;
        auVar85 = vsubps_avx((undefined1  [16])0x0,auVar154);
        auVar82 = vshufpd_avx(auVar162,auVar162,3);
        auVar83 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar73 = vsubps_avx(auVar82,auVar162);
        auVar74 = vsubps_avx(auVar83,(undefined1  [16])0x0);
        auVar190._0_4_ = auVar73._0_4_ + auVar74._0_4_;
        auVar190._4_4_ = auVar73._4_4_ + auVar74._4_4_;
        auVar190._8_4_ = auVar73._8_4_ + auVar74._8_4_;
        auVar190._12_4_ = auVar73._12_4_ + auVar74._12_4_;
        auVar73 = vshufps_avx(auVar162,auVar162,0xb1);
        auVar74 = vshufps_avx(auVar173,auVar173,0xb1);
        auVar81 = vshufps_avx(auVar85,auVar85,0xb1);
        auVar86 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar241._4_4_ = auVar190._0_4_;
        auVar241._0_4_ = auVar190._0_4_;
        auVar241._8_4_ = auVar190._0_4_;
        auVar241._12_4_ = auVar190._0_4_;
        auVar78 = vshufps_avx(auVar190,auVar190,0x55);
        fVar206 = auVar78._0_4_;
        auVar200._0_4_ = auVar73._0_4_ * fVar206;
        fVar217 = auVar78._4_4_;
        auVar200._4_4_ = auVar73._4_4_ * fVar217;
        fVar218 = auVar78._8_4_;
        auVar200._8_4_ = auVar73._8_4_ * fVar218;
        fVar219 = auVar78._12_4_;
        auVar200._12_4_ = auVar73._12_4_ * fVar219;
        auVar208._0_4_ = auVar74._0_4_ * fVar206;
        auVar208._4_4_ = auVar74._4_4_ * fVar217;
        auVar208._8_4_ = auVar74._8_4_ * fVar218;
        auVar208._12_4_ = auVar74._12_4_ * fVar219;
        auVar225._0_4_ = auVar81._0_4_ * fVar206;
        auVar225._4_4_ = auVar81._4_4_ * fVar217;
        auVar225._8_4_ = auVar81._8_4_ * fVar218;
        auVar225._12_4_ = auVar81._12_4_ * fVar219;
        auVar191._0_4_ = auVar86._0_4_ * fVar206;
        auVar191._4_4_ = auVar86._4_4_ * fVar217;
        auVar191._8_4_ = auVar86._8_4_ * fVar218;
        auVar191._12_4_ = auVar86._12_4_ * fVar219;
        auVar73 = vfmadd231ps_fma(auVar200,auVar241,auVar162);
        auVar74 = vfmadd231ps_fma(auVar208,auVar241,auVar173);
        auVar151 = vfmadd231ps_fma(auVar225,auVar241,auVar85);
        auVar80 = vfmadd231ps_fma(auVar191,(undefined1  [16])0x0,auVar241);
        auVar78 = vshufpd_avx(auVar73,auVar73,1);
        auVar79 = vshufpd_avx(auVar74,auVar74,1);
        auVar76 = vshufpd_avx512vl(auVar151,auVar151,1);
        auVar77 = vshufpd_avx512vl(auVar80,auVar80,1);
        auVar253 = ZEXT1664(auVar77);
        auVar81 = vminss_avx(auVar73,auVar74);
        auVar73 = vmaxss_avx(auVar74,auVar73);
        auVar86 = vminss_avx(auVar151,auVar80);
        auVar74 = vmaxss_avx(auVar80,auVar151);
        auVar81 = vminss_avx(auVar81,auVar86);
        auVar73 = vmaxss_avx(auVar74,auVar73);
        auVar86 = vminss_avx(auVar78,auVar79);
        auVar74 = vmaxss_avx(auVar79,auVar78);
        auVar78 = vminss_avx512f(auVar76,auVar77);
        auVar79 = vmaxss_avx512f(auVar77,auVar76);
        auVar74 = vmaxss_avx(auVar79,auVar74);
        auVar109._0_16_ = vminss_avx512f(auVar86,auVar78);
        vucomiss_avx512f(auVar81);
        fVar217 = auVar74._0_4_;
        fVar206 = auVar73._0_4_;
        if (4 < (uint)uVar21) {
          bVar32 = fVar217 == -0.0001;
          bVar29 = NAN(fVar217);
          if (fVar217 <= -0.0001) goto LAB_019306c4;
          break;
        }
LAB_019306c4:
        auVar86 = vucomiss_avx512f(auVar109._0_16_);
        bVar32 = fVar217 <= -0.0001;
        bVar30 = -0.0001 < fVar206;
        bVar29 = bVar32;
        if (!bVar32) break;
        uVar13 = vcmpps_avx512vl(auVar81,auVar86,5);
        uVar14 = vcmpps_avx512vl(auVar109._0_16_,auVar86,5);
        bVar19 = (byte)uVar13 & (byte)uVar14 & 1;
        bVar32 = bVar30 && bVar19 == 0;
        bVar29 = bVar30 && bVar19 == 0;
      } while (!bVar30 || bVar19 != 0);
      vcmpss_avx512f(auVar81,auVar87,1);
      auVar151 = auVar260._0_16_;
      uVar13 = vcmpss_avx512f(auVar73,auVar87,1);
      bVar30 = (bool)((byte)uVar13 & 1);
      auVar113._16_16_ = auVar109._16_16_;
      auVar113._0_16_ = auVar151;
      iVar124 = auVar260._0_4_;
      auVar112._4_28_ = auVar113._4_28_;
      auVar112._0_4_ = (float)((uint)bVar30 * -0x40800000 + (uint)!bVar30 * iVar124);
      vucomiss_avx512f(auVar112._0_16_);
      bVar29 = (bool)(!bVar32 | bVar29);
      bVar30 = bVar29 == false;
      auVar115._16_16_ = auVar109._16_16_;
      auVar115._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
      auVar114._4_28_ = auVar115._4_28_;
      auVar114._0_4_ = (uint)bVar29 * auVar254._0_4_ + (uint)!bVar29 * 0x7f800000;
      auVar78 = auVar114._0_16_;
      auVar117._16_16_ = auVar109._16_16_;
      auVar117._0_16_ = auVar75;
      auVar116._4_28_ = auVar117._4_28_;
      auVar116._0_4_ = (uint)bVar29 * auVar254._0_4_ + (uint)!bVar29 * -0x800000;
      auVar86 = auVar116._0_16_;
      uVar13 = vcmpss_avx512f(auVar109._0_16_,auVar87,1);
      bVar32 = (bool)((byte)uVar13 & 1);
      auVar119._16_16_ = auVar109._16_16_;
      auVar119._0_16_ = auVar151;
      auVar118._4_28_ = auVar119._4_28_;
      auVar118._0_4_ = (float)((uint)bVar32 * -0x40800000 + (uint)!bVar32 * iVar124);
      auVar79 = vucomiss_avx512f(auVar118._0_16_);
      auVar253 = ZEXT1664(auVar79);
      if ((bVar29) || (bVar30)) {
        auVar79 = vucomiss_avx512f(auVar81);
        if ((bVar29) || (bVar30)) {
          auVar80 = vxorps_avx512vl(auVar81,auVar261._0_16_);
          auVar253 = ZEXT1664(auVar80);
          auVar81 = vsubss_avx512f(auVar79,auVar81);
          auVar81 = vdivss_avx512f(auVar80,auVar81);
          auVar79 = vsubss_avx512f(auVar151,auVar81);
          auVar81 = vfmadd213ss_avx512f(auVar79,auVar87,auVar81);
          auVar79 = auVar81;
        }
        else {
          auVar79 = vxorps_avx512vl(auVar79,auVar79);
          vucomiss_avx512f(auVar79);
          if ((bVar29) || (auVar81 = auVar151, bVar30)) {
            auVar81 = auVar75;
            auVar79 = ZEXT416(0x7f800000);
          }
        }
        auVar78 = vminss_avx512f(auVar78,auVar79);
        auVar86 = vmaxss_avx(auVar81,auVar86);
      }
      uVar13 = vcmpss_avx512f(auVar74,auVar87,1);
      bVar32 = (bool)((byte)uVar13 & 1);
      fVar218 = (float)((uint)bVar32 * -0x40800000 + (uint)!bVar32 * iVar124);
      if ((auVar112._0_4_ != fVar218) || (NAN(auVar112._0_4_) || NAN(fVar218))) {
        if ((fVar217 != fVar206) || (NAN(fVar217) || NAN(fVar206))) {
          auVar75 = vxorps_avx512vl(auVar73,auVar261._0_16_);
          auVar192._0_4_ = auVar75._0_4_ / (fVar217 - fVar206);
          auVar192._4_12_ = auVar75._4_12_;
          auVar75 = vsubss_avx512f(auVar151,auVar192);
          auVar73 = vfmadd213ss_avx512f(auVar75,auVar87,auVar192);
          auVar74 = auVar73;
        }
        else if ((fVar206 != 0.0) ||
                (auVar73 = auVar151, auVar74 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar206))) {
          auVar73 = auVar75;
          auVar74 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar78 = vminss_avx(auVar78,auVar74);
        auVar86 = vmaxss_avx(auVar73,auVar86);
      }
      bVar32 = auVar118._0_4_ != fVar218;
      auVar75 = vminss_avx512f(auVar78,auVar151);
      auVar121._16_16_ = auVar109._16_16_;
      auVar121._0_16_ = auVar78;
      auVar120._4_28_ = auVar121._4_28_;
      auVar120._0_4_ = (uint)bVar32 * auVar75._0_4_ + (uint)!bVar32 * auVar78._0_4_;
      auVar75 = vmaxss_avx512f(auVar151,auVar86);
      auVar123._16_16_ = auVar109._16_16_;
      auVar123._0_16_ = auVar86;
      auVar122._4_28_ = auVar123._4_28_;
      auVar122._0_4_ = (uint)bVar32 * auVar75._0_4_ + (uint)!bVar32 * auVar86._0_4_;
      auVar75 = vmaxss_avx512f(auVar87,auVar120._0_16_);
      auVar109._0_16_ = vminss_avx512f(auVar122._0_16_,auVar151);
    } while (auVar109._0_4_ < auVar75._0_4_);
    auVar79 = vmaxss_avx512f(auVar87,ZEXT416((uint)(auVar75._0_4_ + -0.1)));
    auVar76 = vminss_avx512f(ZEXT416((uint)(auVar109._0_4_ + 0.1)),auVar151);
    auVar140._0_8_ = auVar162._0_8_;
    auVar140._8_8_ = auVar140._0_8_;
    auVar209._8_8_ = auVar173._0_8_;
    auVar209._0_8_ = auVar173._0_8_;
    auVar226._8_8_ = auVar85._0_8_;
    auVar226._0_8_ = auVar85._0_8_;
    auVar75 = vshufpd_avx(auVar173,auVar173,3);
    auVar73 = vshufpd_avx(auVar85,auVar85,3);
    auVar74 = vshufps_avx(auVar79,auVar76,0);
    auVar242._8_4_ = 0x3f800000;
    auVar242._0_8_ = 0x3f8000003f800000;
    auVar242._12_4_ = 0x3f800000;
    auVar81 = vsubps_avx(auVar242,auVar74);
    fVar206 = auVar74._0_4_;
    auVar166._0_4_ = fVar206 * auVar82._0_4_;
    fVar217 = auVar74._4_4_;
    auVar166._4_4_ = fVar217 * auVar82._4_4_;
    fVar218 = auVar74._8_4_;
    auVar166._8_4_ = fVar218 * auVar82._8_4_;
    fVar219 = auVar74._12_4_;
    auVar166._12_4_ = fVar219 * auVar82._12_4_;
    auVar174._0_4_ = fVar206 * auVar75._0_4_;
    auVar174._4_4_ = fVar217 * auVar75._4_4_;
    auVar174._8_4_ = fVar218 * auVar75._8_4_;
    auVar174._12_4_ = fVar219 * auVar75._12_4_;
    auVar248._0_4_ = auVar73._0_4_ * fVar206;
    auVar248._4_4_ = auVar73._4_4_ * fVar217;
    auVar248._8_4_ = auVar73._8_4_ * fVar218;
    auVar248._12_4_ = auVar73._12_4_ * fVar219;
    auVar155._0_4_ = fVar206 * auVar83._0_4_;
    auVar155._4_4_ = fVar217 * auVar83._4_4_;
    auVar155._8_4_ = fVar218 * auVar83._8_4_;
    auVar155._12_4_ = fVar219 * auVar83._12_4_;
    auVar86 = vfmadd231ps_fma(auVar166,auVar81,auVar140);
    auVar82 = vfmadd231ps_fma(auVar174,auVar81,auVar209);
    auVar83 = vfmadd231ps_fma(auVar248,auVar81,auVar226);
    auVar78 = vfmadd231ps_fma(auVar155,auVar81,ZEXT816(0));
    auVar73 = vsubss_avx512f(auVar151,auVar79);
    auVar75 = vmovshdup_avx(auVar36);
    auVar80 = vfmadd231ss_fma(ZEXT416((uint)(auVar75._0_4_ * auVar79._0_4_)),auVar36,auVar73);
    auVar73 = vsubss_avx512f(auVar151,auVar76);
    auVar162 = vfmadd231ss_fma(ZEXT416((uint)(auVar75._0_4_ * auVar76._0_4_)),auVar36,auVar73);
    auVar81 = vdivss_avx512f(auVar151,ZEXT416((uint)fVar222));
    auVar36 = vsubps_avx(auVar82,auVar86);
    auVar73 = vmulps_avx512vl(auVar36,auVar137);
    auVar36 = vsubps_avx(auVar83,auVar82);
    auVar74 = vmulps_avx512vl(auVar36,auVar137);
    auVar36 = vsubps_avx(auVar78,auVar83);
    auVar36 = vmulps_avx512vl(auVar36,auVar137);
    auVar75 = vminps_avx(auVar74,auVar36);
    auVar36 = vmaxps_avx(auVar74,auVar36);
    auVar75 = vminps_avx(auVar73,auVar75);
    auVar36 = vmaxps_avx(auVar73,auVar36);
    auVar73 = vshufpd_avx(auVar75,auVar75,3);
    auVar74 = vshufpd_avx(auVar36,auVar36,3);
    auVar75 = vminps_avx(auVar75,auVar73);
    auVar36 = vmaxps_avx(auVar36,auVar74);
    fVar222 = auVar81._0_4_;
    auVar193._0_4_ = auVar75._0_4_ * fVar222;
    auVar193._4_4_ = auVar75._4_4_ * fVar222;
    auVar193._8_4_ = auVar75._8_4_ * fVar222;
    auVar193._12_4_ = auVar75._12_4_ * fVar222;
    auVar180._0_4_ = fVar222 * auVar36._0_4_;
    auVar180._4_4_ = fVar222 * auVar36._4_4_;
    auVar180._8_4_ = fVar222 * auVar36._8_4_;
    auVar180._12_4_ = fVar222 * auVar36._12_4_;
    auVar79 = vdivss_avx512f(auVar151,ZEXT416((uint)(auVar162._0_4_ - auVar80._0_4_)));
    auVar36 = vshufpd_avx(auVar86,auVar86,3);
    auVar75 = vshufpd_avx(auVar82,auVar82,3);
    auVar73 = vshufpd_avx(auVar83,auVar83,3);
    auVar74 = vshufpd_avx(auVar78,auVar78,3);
    auVar36 = vsubps_avx(auVar36,auVar86);
    auVar81 = vsubps_avx(auVar75,auVar82);
    auVar86 = vsubps_avx(auVar73,auVar83);
    auVar74 = vsubps_avx(auVar74,auVar78);
    auVar75 = vminps_avx(auVar36,auVar81);
    auVar36 = vmaxps_avx(auVar36,auVar81);
    auVar73 = vminps_avx(auVar86,auVar74);
    auVar73 = vminps_avx(auVar75,auVar73);
    auVar75 = vmaxps_avx(auVar86,auVar74);
    auVar36 = vmaxps_avx(auVar36,auVar75);
    fVar222 = auVar79._0_4_;
    auVar227._0_4_ = fVar222 * auVar73._0_4_;
    auVar227._4_4_ = fVar222 * auVar73._4_4_;
    auVar227._8_4_ = fVar222 * auVar73._8_4_;
    auVar227._12_4_ = fVar222 * auVar73._12_4_;
    auVar210._0_4_ = fVar222 * auVar36._0_4_;
    auVar210._4_4_ = fVar222 * auVar36._4_4_;
    auVar210._8_4_ = fVar222 * auVar36._8_4_;
    auVar210._12_4_ = fVar222 * auVar36._12_4_;
    auVar74 = vinsertps_avx(auVar47,auVar80,0x10);
    auVar76 = vpermt2ps_avx512vl(auVar47,_DAT_01fb9f90,auVar162);
    auVar130._0_4_ = auVar74._0_4_ + auVar76._0_4_;
    auVar130._4_4_ = auVar74._4_4_ + auVar76._4_4_;
    auVar130._8_4_ = auVar74._8_4_ + auVar76._8_4_;
    auVar130._12_4_ = auVar74._12_4_ + auVar76._12_4_;
    auVar17._8_4_ = 0x3f000000;
    auVar17._0_8_ = 0x3f0000003f000000;
    auVar17._12_4_ = 0x3f000000;
    auVar78 = vmulps_avx512vl(auVar130,auVar17);
    auVar75 = vshufps_avx(auVar78,auVar78,0x54);
    uVar125 = auVar78._0_4_;
    auVar132._4_4_ = uVar125;
    auVar132._0_4_ = uVar125;
    auVar132._8_4_ = uVar125;
    auVar132._12_4_ = uVar125;
    auVar73 = vfmadd213ps_fma(auVar52,auVar132,auVar55);
    auVar81 = vfmadd213ps_fma(auVar50,auVar132,auVar56);
    auVar86 = vfmadd213ps_fma(auVar53,auVar132,auVar58);
    auVar36 = vsubps_avx(auVar81,auVar73);
    auVar73 = vfmadd213ps_fma(auVar36,auVar132,auVar73);
    auVar36 = vsubps_avx(auVar86,auVar81);
    auVar36 = vfmadd213ps_fma(auVar36,auVar132,auVar81);
    auVar36 = vsubps_avx(auVar36,auVar73);
    auVar73 = vfmadd231ps_fma(auVar73,auVar36,auVar132);
    auVar82 = vmulps_avx512vl(auVar36,auVar137);
    auVar235._8_8_ = auVar73._0_8_;
    auVar235._0_8_ = auVar73._0_8_;
    auVar36 = vshufpd_avx(auVar73,auVar73,3);
    auVar73 = vshufps_avx(auVar78,auVar78,0x55);
    auVar81 = vsubps_avx(auVar36,auVar235);
    auVar86 = vfmadd231ps_fma(auVar235,auVar73,auVar81);
    auVar249._8_8_ = auVar82._0_8_;
    auVar249._0_8_ = auVar82._0_8_;
    auVar36 = vshufpd_avx(auVar82,auVar82,3);
    auVar36 = vsubps_avx512vl(auVar36,auVar249);
    auVar36 = vfmadd213ps_avx512vl(auVar36,auVar73,auVar249);
    auVar133._0_8_ = auVar81._0_8_ ^ 0x8000000080000000;
    auVar133._8_4_ = auVar81._8_4_ ^ 0x80000000;
    auVar133._12_4_ = auVar81._12_4_ ^ 0x80000000;
    auVar73 = vmovshdup_avx512vl(auVar36);
    auVar250._0_8_ = auVar73._0_8_ ^ 0x8000000080000000;
    auVar250._8_4_ = auVar73._8_4_ ^ 0x80000000;
    auVar250._12_4_ = auVar73._12_4_ ^ 0x80000000;
    auVar82 = vmovshdup_avx512vl(auVar81);
    auVar83 = vpermt2ps_avx512vl(auVar250,ZEXT416(5),auVar81);
    auVar73 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar73._0_4_ * auVar81._0_4_)),auVar36,auVar82);
    auVar81 = vpermt2ps_avx512vl(auVar36,SUB6416(ZEXT464(4),0),auVar133);
    auVar156._0_4_ = auVar73._0_4_;
    auVar156._4_4_ = auVar156._0_4_;
    auVar156._8_4_ = auVar156._0_4_;
    auVar156._12_4_ = auVar156._0_4_;
    auVar36 = vdivps_avx(auVar83,auVar156);
    auVar77 = vdivps_avx512vl(auVar81,auVar156);
    fVar222 = auVar86._0_4_;
    auVar73 = vshufps_avx(auVar86,auVar86,0x55);
    auVar236._0_4_ = fVar222 * auVar36._0_4_ + auVar73._0_4_ * auVar77._0_4_;
    auVar236._4_4_ = fVar222 * auVar36._4_4_ + auVar73._4_4_ * auVar77._4_4_;
    auVar236._8_4_ = fVar222 * auVar36._8_4_ + auVar73._8_4_ * auVar77._8_4_;
    auVar236._12_4_ = fVar222 * auVar36._12_4_ + auVar73._12_4_ * auVar77._12_4_;
    auVar79 = vsubps_avx(auVar75,auVar236);
    auVar73 = vmovshdup_avx(auVar36);
    auVar75 = vinsertps_avx(auVar193,auVar227,0x1c);
    auVar251._0_4_ = auVar73._0_4_ * auVar75._0_4_;
    auVar251._4_4_ = auVar73._4_4_ * auVar75._4_4_;
    auVar251._8_4_ = auVar73._8_4_ * auVar75._8_4_;
    auVar251._12_4_ = auVar73._12_4_ * auVar75._12_4_;
    auVar85 = vinsertps_avx512f(auVar180,auVar210,0x1c);
    auVar73 = vmulps_avx512vl(auVar73,auVar85);
    auVar83 = vminps_avx512vl(auVar251,auVar73);
    auVar86 = vmaxps_avx(auVar73,auVar251);
    auVar82 = vmovshdup_avx(auVar77);
    auVar73 = vinsertps_avx(auVar227,auVar193,0x4c);
    auVar228._0_4_ = auVar82._0_4_ * auVar73._0_4_;
    auVar228._4_4_ = auVar82._4_4_ * auVar73._4_4_;
    auVar228._8_4_ = auVar82._8_4_ * auVar73._8_4_;
    auVar228._12_4_ = auVar82._12_4_ * auVar73._12_4_;
    auVar81 = vinsertps_avx(auVar210,auVar180,0x4c);
    auVar211._0_4_ = auVar82._0_4_ * auVar81._0_4_;
    auVar211._4_4_ = auVar82._4_4_ * auVar81._4_4_;
    auVar211._8_4_ = auVar82._8_4_ * auVar81._8_4_;
    auVar211._12_4_ = auVar82._12_4_ * auVar81._12_4_;
    auVar82 = vminps_avx(auVar228,auVar211);
    auVar83 = vaddps_avx512vl(auVar83,auVar82);
    auVar82 = vmaxps_avx(auVar211,auVar228);
    auVar212._0_4_ = auVar86._0_4_ + auVar82._0_4_;
    auVar212._4_4_ = auVar86._4_4_ + auVar82._4_4_;
    auVar212._8_4_ = auVar86._8_4_ + auVar82._8_4_;
    auVar212._12_4_ = auVar86._12_4_ + auVar82._12_4_;
    auVar229._8_8_ = 0x3f80000000000000;
    auVar229._0_8_ = 0x3f80000000000000;
    auVar86 = vsubps_avx(auVar229,auVar212);
    auVar82 = vsubps_avx(auVar229,auVar83);
    auVar83 = vsubps_avx(auVar74,auVar78);
    auVar78 = vsubps_avx(auVar76,auVar78);
    fVar219 = auVar83._0_4_;
    auVar252._0_4_ = fVar219 * auVar86._0_4_;
    fVar220 = auVar83._4_4_;
    auVar252._4_4_ = fVar220 * auVar86._4_4_;
    fVar221 = auVar83._8_4_;
    auVar252._8_4_ = fVar221 * auVar86._8_4_;
    fVar159 = auVar83._12_4_;
    auVar252._12_4_ = fVar159 * auVar86._12_4_;
    auVar84 = vbroadcastss_avx512vl(auVar36);
    auVar75 = vmulps_avx512vl(auVar84,auVar75);
    auVar85 = vmulps_avx512vl(auVar84,auVar85);
    auVar84 = vminps_avx512vl(auVar75,auVar85);
    auVar85 = vmaxps_avx512vl(auVar85,auVar75);
    auVar75 = vbroadcastss_avx512vl(auVar77);
    auVar73 = vmulps_avx512vl(auVar75,auVar73);
    auVar75 = vmulps_avx512vl(auVar75,auVar81);
    auVar81 = vminps_avx512vl(auVar73,auVar75);
    auVar81 = vaddps_avx512vl(auVar84,auVar81);
    auVar83 = vmulps_avx512vl(auVar83,auVar82);
    auVar253 = ZEXT1664(auVar83);
    fVar222 = auVar78._0_4_;
    auVar213._0_4_ = fVar222 * auVar86._0_4_;
    fVar206 = auVar78._4_4_;
    auVar213._4_4_ = fVar206 * auVar86._4_4_;
    fVar217 = auVar78._8_4_;
    auVar213._8_4_ = fVar217 * auVar86._8_4_;
    fVar218 = auVar78._12_4_;
    auVar213._12_4_ = fVar218 * auVar86._12_4_;
    auVar230._0_4_ = fVar222 * auVar82._0_4_;
    auVar230._4_4_ = fVar206 * auVar82._4_4_;
    auVar230._8_4_ = fVar217 * auVar82._8_4_;
    auVar230._12_4_ = fVar218 * auVar82._12_4_;
    auVar75 = vmaxps_avx(auVar75,auVar73);
    auVar181._0_4_ = auVar85._0_4_ + auVar75._0_4_;
    auVar181._4_4_ = auVar85._4_4_ + auVar75._4_4_;
    auVar181._8_4_ = auVar85._8_4_ + auVar75._8_4_;
    auVar181._12_4_ = auVar85._12_4_ + auVar75._12_4_;
    auVar194._8_8_ = 0x3f800000;
    auVar194._0_8_ = 0x3f800000;
    auVar75 = vsubps_avx(auVar194,auVar181);
    auVar73 = vsubps_avx512vl(auVar194,auVar81);
    auVar243._0_4_ = fVar219 * auVar75._0_4_;
    auVar243._4_4_ = fVar220 * auVar75._4_4_;
    auVar243._8_4_ = fVar221 * auVar75._8_4_;
    auVar243._12_4_ = fVar159 * auVar75._12_4_;
    auVar237._0_4_ = fVar219 * auVar73._0_4_;
    auVar237._4_4_ = fVar220 * auVar73._4_4_;
    auVar237._8_4_ = fVar221 * auVar73._8_4_;
    auVar237._12_4_ = fVar159 * auVar73._12_4_;
    auVar182._0_4_ = fVar222 * auVar75._0_4_;
    auVar182._4_4_ = fVar206 * auVar75._4_4_;
    auVar182._8_4_ = fVar217 * auVar75._8_4_;
    auVar182._12_4_ = fVar218 * auVar75._12_4_;
    auVar195._0_4_ = fVar222 * auVar73._0_4_;
    auVar195._4_4_ = fVar206 * auVar73._4_4_;
    auVar195._8_4_ = fVar217 * auVar73._8_4_;
    auVar195._12_4_ = fVar218 * auVar73._12_4_;
    auVar75 = vminps_avx(auVar243,auVar237);
    auVar73 = vminps_avx512vl(auVar182,auVar195);
    auVar81 = vminps_avx512vl(auVar75,auVar73);
    auVar75 = vmaxps_avx(auVar237,auVar243);
    auVar73 = vmaxps_avx(auVar195,auVar182);
    auVar73 = vmaxps_avx(auVar73,auVar75);
    auVar86 = vminps_avx512vl(auVar252,auVar83);
    auVar75 = vminps_avx(auVar213,auVar230);
    auVar75 = vminps_avx(auVar86,auVar75);
    auVar75 = vhaddps_avx(auVar81,auVar75);
    auVar109._0_16_ = vmaxps_avx512vl(auVar83,auVar252);
    auVar81 = vmaxps_avx(auVar230,auVar213);
    auVar81 = vmaxps_avx(auVar81,auVar109._0_16_);
    auVar73 = vhaddps_avx(auVar73,auVar81);
    auVar75 = vshufps_avx(auVar75,auVar75,0xe8);
    auVar73 = vshufps_avx(auVar73,auVar73,0xe8);
    auVar183._0_4_ = auVar75._0_4_ + auVar79._0_4_;
    auVar183._4_4_ = auVar75._4_4_ + auVar79._4_4_;
    auVar183._8_4_ = auVar75._8_4_ + auVar79._8_4_;
    auVar183._12_4_ = auVar75._12_4_ + auVar79._12_4_;
    auVar196._0_4_ = auVar73._0_4_ + auVar79._0_4_;
    auVar196._4_4_ = auVar73._4_4_ + auVar79._4_4_;
    auVar196._8_4_ = auVar73._8_4_ + auVar79._8_4_;
    auVar196._12_4_ = auVar73._12_4_ + auVar79._12_4_;
    auVar75 = vmaxps_avx(auVar74,auVar183);
    auVar73 = vminps_avx(auVar196,auVar76);
    uVar33 = vcmpps_avx512vl(auVar73,auVar75,1);
  } while ((uVar33 & 3) != 0);
  uVar33 = vcmpps_avx512vl(auVar196,auVar76,1);
  uVar13 = vcmpps_avx512vl(auVar47,auVar183,1);
  if (((ushort)uVar13 & (ushort)uVar33 & 1) == 0) {
    bVar19 = 0;
  }
  else {
    auVar75 = vmovshdup_avx(auVar183);
    bVar19 = auVar80._0_4_ < auVar75._0_4_ & (byte)(uVar33 >> 1) & 0x7f;
  }
  p03.field_0.i[0] = auVar43._0_4_;
  p03.field_0.i[1] = auVar43._4_4_;
  p03.field_0.i[2] = auVar43._8_4_;
  p03.field_0.i[3] = auVar43._12_4_;
  if (((3 < (uint)uVar21 || uVar5 != 0 && !bVar31) | bVar19) != 1) goto LAB_019312fc;
  lVar22 = 0xc9;
  do {
    lVar22 = lVar22 + -1;
    if (lVar22 == 0) goto LAB_01930497;
    auVar47 = vsubss_avx512f(auVar151,auVar79);
    fVar217 = auVar47._0_4_;
    fVar222 = fVar217 * fVar217 * fVar217;
    auVar47 = vmulss_avx512f(auVar79,ZEXT416(0x40400000));
    fVar206 = auVar47._0_4_ * fVar217 * fVar217;
    fVar218 = auVar79._0_4_;
    auVar47 = vmulss_avx512f(ZEXT416((uint)(fVar218 * fVar218)),ZEXT416(0x40400000));
    fVar217 = fVar217 * auVar47._0_4_;
    auVar146._4_4_ = fVar222;
    auVar146._0_4_ = fVar222;
    auVar146._8_4_ = fVar222;
    auVar146._12_4_ = fVar222;
    auVar141._4_4_ = fVar206;
    auVar141._0_4_ = fVar206;
    auVar141._8_4_ = fVar206;
    auVar141._12_4_ = fVar206;
    auVar127._4_4_ = fVar217;
    auVar127._0_4_ = fVar217;
    auVar127._8_4_ = fVar217;
    auVar127._12_4_ = fVar217;
    fVar218 = fVar218 * fVar218 * fVar218;
    auVar167._0_4_ = p03.field_0.v[0] * fVar218;
    auVar167._4_4_ = p03.field_0.v[1] * fVar218;
    auVar167._8_4_ = p03.field_0.v[2] * fVar218;
    auVar167._12_4_ = p03.field_0.v[3] * fVar218;
    auVar47 = vfmadd231ps_fma(auVar167,auVar58,auVar127);
    auVar47 = vfmadd231ps_fma(auVar47,auVar56,auVar141);
    auVar47 = vfmadd231ps_fma(auVar47,auVar55,auVar146);
    auVar128._8_8_ = auVar47._0_8_;
    auVar128._0_8_ = auVar47._0_8_;
    auVar47 = vshufpd_avx(auVar47,auVar47,3);
    auVar75 = vshufps_avx(auVar79,auVar79,0x55);
    auVar47 = vsubps_avx(auVar47,auVar128);
    auVar75 = vfmadd213ps_fma(auVar47,auVar75,auVar128);
    fVar222 = auVar75._0_4_;
    auVar47 = vshufps_avx(auVar75,auVar75,0x55);
    auVar129._0_4_ = auVar36._0_4_ * fVar222 + auVar77._0_4_ * auVar47._0_4_;
    auVar129._4_4_ = auVar36._4_4_ * fVar222 + auVar77._4_4_ * auVar47._4_4_;
    auVar129._8_4_ = auVar36._8_4_ * fVar222 + auVar77._8_4_ * auVar47._8_4_;
    auVar129._12_4_ = auVar36._12_4_ * fVar222 + auVar77._12_4_ * auVar47._12_4_;
    auVar79 = vsubps_avx(auVar79,auVar129);
    auVar47 = vandps_avx512vl(auVar75,auVar259._0_16_);
    auVar109._0_16_ = vprolq_avx512vl(auVar47,0x20);
    auVar47 = vmaxss_avx(auVar109._0_16_,auVar47);
    bVar31 = fVar170 < auVar47._0_4_;
  } while (fVar170 <= auVar47._0_4_);
  auVar47 = vucomiss_avx512f(auVar87);
  if (bVar31) goto LAB_01930497;
  auVar36 = vucomiss_avx512f(auVar47);
  auVar260 = ZEXT1664(auVar36);
  if (bVar31) goto LAB_01930497;
  vmovshdup_avx(auVar47);
  auVar36 = vucomiss_avx512f(auVar87);
  if (bVar31) goto LAB_01930497;
  auVar75 = vucomiss_avx512f(auVar36);
  auVar260 = ZEXT1664(auVar75);
  if (bVar31) goto LAB_01930497;
  auVar73 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                          ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
  auVar79 = vinsertps_avx(auVar73,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
  auVar73 = vdpps_avx(auVar79,auVar64,0x7f);
  auVar74 = vdpps_avx(auVar79,auVar65,0x7f);
  auVar81 = vdpps_avx(auVar79,auVar66,0x7f);
  auVar86 = vdpps_avx(auVar79,auVar40,0x7f);
  auVar82 = vdpps_avx(auVar79,auVar67,0x7f);
  auVar83 = vdpps_avx(auVar79,auVar68,0x7f);
  auVar78 = vdpps_avx(auVar79,auVar69,0x7f);
  auVar79 = vdpps_avx(auVar79,auVar41,0x7f);
  auVar85 = vsubss_avx512f(auVar75,auVar36);
  fVar222 = auVar36._0_4_;
  auVar36 = vfmadd231ss_fma(ZEXT416((uint)(fVar222 * auVar82._0_4_)),auVar85,auVar73);
  auVar73 = vfmadd231ss_fma(ZEXT416((uint)(auVar83._0_4_ * fVar222)),auVar85,auVar74);
  auVar74 = vfmadd231ss_fma(ZEXT416((uint)(auVar78._0_4_ * fVar222)),auVar85,auVar81);
  auVar81 = vfmadd231ss_fma(ZEXT416((uint)(fVar222 * auVar79._0_4_)),auVar85,auVar86);
  auVar75 = vsubss_avx512f(auVar75,auVar47);
  auVar175._0_4_ = auVar75._0_4_;
  fVar222 = auVar175._0_4_ * auVar175._0_4_ * auVar175._0_4_;
  auVar75 = vmulss_avx512f(auVar47,ZEXT416(0x40400000));
  fVar206 = auVar75._0_4_ * auVar175._0_4_ * auVar175._0_4_;
  local_b8 = auVar47._0_4_;
  auVar157._0_4_ = local_b8 * local_b8;
  auVar157._4_4_ = auVar47._4_4_ * auVar47._4_4_;
  auVar157._8_4_ = auVar47._8_4_ * auVar47._8_4_;
  auVar157._12_4_ = auVar47._12_4_ * auVar47._12_4_;
  auVar109._0_16_ = vmulss_avx512f(auVar157,ZEXT416(0x40400000));
  fVar217 = auVar175._0_4_ * auVar109._0_4_;
  fVar219 = local_b8 * auVar157._0_4_;
  auVar75 = vfmadd231ss_fma(ZEXT416((uint)(fVar219 * auVar81._0_4_)),ZEXT416((uint)fVar217),auVar74)
  ;
  auVar75 = vfmadd231ss_fma(auVar75,ZEXT416((uint)fVar206),auVar73);
  auVar36 = vfmadd231ss_fma(auVar75,ZEXT416((uint)fVar222),auVar36);
  fVar218 = auVar36._0_4_;
  if ((fVar218 < fVar150) || (fVar220 = *(float *)(ray + k * 4 + 0x80), fVar220 < fVar218))
  goto LAB_01930497;
  local_a8 = vshufps_avx(auVar47,auVar47,0x55);
  auVar184._8_4_ = 0x3f800000;
  auVar184._0_8_ = 0x3f8000003f800000;
  auVar184._12_4_ = 0x3f800000;
  auVar47 = vsubps_avx(auVar184,local_a8);
  local_268 = auVar61._0_4_;
  fStack_264 = auVar61._4_4_;
  fStack_260 = auVar61._8_4_;
  fStack_25c = auVar61._12_4_;
  fVar221 = local_a8._0_4_;
  auVar197._0_4_ = fVar221 * local_268;
  fVar159 = local_a8._4_4_;
  auVar197._4_4_ = fVar159 * fStack_264;
  fVar160 = local_a8._8_4_;
  auVar197._8_4_ = fVar160 * fStack_260;
  fVar161 = local_a8._12_4_;
  auVar197._12_4_ = fVar161 * fStack_25c;
  local_278 = auVar62._0_4_;
  fStack_274 = auVar62._4_4_;
  fStack_270 = auVar62._8_4_;
  fStack_26c = auVar62._12_4_;
  auVar201._0_4_ = fVar221 * local_278;
  auVar201._4_4_ = fVar159 * fStack_274;
  auVar201._8_4_ = fVar160 * fStack_270;
  auVar201._12_4_ = fVar161 * fStack_26c;
  local_288 = auVar63._0_4_;
  fStack_284 = auVar63._4_4_;
  fStack_280 = auVar63._8_4_;
  fStack_27c = auVar63._12_4_;
  auVar214._0_4_ = fVar221 * local_288;
  auVar214._4_4_ = fVar159 * fStack_284;
  auVar214._8_4_ = fVar160 * fStack_280;
  auVar214._12_4_ = fVar161 * fStack_27c;
  local_298 = auVar46._0_4_;
  fStack_294 = auVar46._4_4_;
  fStack_290 = auVar46._8_4_;
  fStack_28c = auVar46._12_4_;
  auVar231._0_4_ = fVar221 * local_298;
  auVar231._4_4_ = fVar159 * fStack_294;
  auVar231._8_4_ = fVar160 * fStack_290;
  auVar231._12_4_ = fVar161 * fStack_28c;
  auVar36 = vfmadd231ps_fma(auVar197,auVar47,auVar39);
  auVar75 = vfmadd231ps_fma(auVar201,auVar47,auVar59);
  auVar73 = vfmadd231ps_fma(auVar214,auVar47,auVar60);
  auVar74 = vfmadd231ps_fma(auVar231,auVar47,auVar44);
  auVar47 = vsubps_avx(auVar75,auVar36);
  auVar36 = vsubps_avx(auVar73,auVar75);
  auVar75 = vsubps_avx(auVar74,auVar73);
  auVar215._0_4_ = auVar36._0_4_ * local_b8;
  auVar215._4_4_ = auVar36._4_4_ * local_b8;
  auVar215._8_4_ = auVar36._8_4_ * local_b8;
  auVar215._12_4_ = auVar36._12_4_ * local_b8;
  auVar175._4_4_ = auVar175._0_4_;
  auVar175._8_4_ = auVar175._0_4_;
  auVar175._12_4_ = auVar175._0_4_;
  auVar47 = vfmadd231ps_fma(auVar215,auVar175,auVar47);
  auVar185._0_4_ = auVar75._0_4_ * local_b8;
  auVar185._4_4_ = auVar75._4_4_ * local_b8;
  auVar185._8_4_ = auVar75._8_4_ * local_b8;
  auVar185._12_4_ = auVar75._12_4_ * local_b8;
  auVar36 = vfmadd231ps_fma(auVar185,auVar175,auVar36);
  auVar186._0_4_ = auVar36._0_4_ * local_b8;
  auVar186._4_4_ = auVar36._4_4_ * local_b8;
  auVar186._8_4_ = auVar36._8_4_ * local_b8;
  auVar186._12_4_ = auVar36._12_4_ * local_b8;
  auVar47 = vfmadd231ps_fma(auVar186,auVar175,auVar47);
  auVar109._0_16_ = vmulps_avx512vl(auVar47,auVar137);
  pGVar6 = (context->scene->geometries).items[uVar4].ptr;
  if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
       (bVar19 = 1, pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_019312f1;
    local_2f8 = auVar45._0_4_;
    fStack_2f4 = auVar45._4_4_;
    fStack_2f0 = auVar45._8_4_;
    fStack_2ec = auVar45._12_4_;
    auVar168._0_4_ = fVar219 * local_2f8;
    auVar168._4_4_ = fVar219 * fStack_2f4;
    auVar168._8_4_ = fVar219 * fStack_2f0;
    auVar168._12_4_ = fVar219 * fStack_2ec;
    auVar147._4_4_ = fVar217;
    auVar147._0_4_ = fVar217;
    auVar147._8_4_ = fVar217;
    auVar147._12_4_ = fVar217;
    auVar47 = vfmadd132ps_fma(auVar147,auVar168,auVar71);
    auVar142._4_4_ = fVar206;
    auVar142._0_4_ = fVar206;
    auVar142._8_4_ = fVar206;
    auVar142._12_4_ = fVar206;
    auVar47 = vfmadd132ps_fma(auVar142,auVar47,auVar57);
    auVar134._4_4_ = fVar222;
    auVar134._0_4_ = fVar222;
    auVar134._8_4_ = fVar222;
    auVar134._12_4_ = fVar222;
    auVar137 = vfmadd132ps_fma(auVar134,auVar47,auVar54);
    auVar47 = vshufps_avx(auVar137,auVar137,0xc9);
    auVar36 = vshufps_avx(auVar109._0_16_,auVar109._0_16_,0xc9);
    auVar135._0_4_ = auVar137._0_4_ * auVar36._0_4_;
    auVar135._4_4_ = auVar137._4_4_ * auVar36._4_4_;
    auVar135._8_4_ = auVar137._8_4_ * auVar36._8_4_;
    auVar135._12_4_ = auVar137._12_4_ * auVar36._12_4_;
    auVar36 = vfmsub231ps_fma(auVar135,auVar109._0_16_,auVar47);
    auVar47 = vshufps_avx(auVar36,auVar36,0x55);
    local_d8 = vshufps_avx(auVar36,auVar36,0xaa);
    local_c8 = auVar36._0_4_;
    local_e8[0] = (RTCHitN)auVar47[0];
    local_e8[1] = (RTCHitN)auVar47[1];
    local_e8[2] = (RTCHitN)auVar47[2];
    local_e8[3] = (RTCHitN)auVar47[3];
    local_e8[4] = (RTCHitN)auVar47[4];
    local_e8[5] = (RTCHitN)auVar47[5];
    local_e8[6] = (RTCHitN)auVar47[6];
    local_e8[7] = (RTCHitN)auVar47[7];
    local_e8[8] = (RTCHitN)auVar47[8];
    local_e8[9] = (RTCHitN)auVar47[9];
    local_e8[10] = (RTCHitN)auVar47[10];
    local_e8[0xb] = (RTCHitN)auVar47[0xb];
    local_e8[0xc] = (RTCHitN)auVar47[0xc];
    local_e8[0xd] = (RTCHitN)auVar47[0xd];
    local_e8[0xe] = (RTCHitN)auVar47[0xe];
    local_e8[0xf] = (RTCHitN)auVar47[0xf];
    uStack_c4 = local_c8;
    uStack_c0 = local_c8;
    uStack_bc = local_c8;
    fStack_b4 = local_b8;
    fStack_b0 = local_b8;
    fStack_ac = local_b8;
    local_2b8 = auVar42._0_8_;
    uStack_2b0 = auVar42._8_8_;
    local_98 = local_2b8;
    uStack_90 = uStack_2b0;
    local_88 = auVar72;
    vpcmpeqd_avx2(ZEXT1632(auVar72),ZEXT1632(auVar72));
    uStack_74 = context->user->instID[0];
    local_78 = uStack_74;
    uStack_70 = uStack_74;
    uStack_6c = uStack_74;
    uStack_68 = context->user->instPrimID[0];
    uStack_64 = uStack_68;
    uStack_60 = uStack_68;
    uStack_5c = uStack_68;
    *(float *)(ray + k * 4 + 0x80) = fVar218;
    args.valid = (int *)local_378;
    args.geometryUserPtr = pGVar6->userPtr;
    args.context = context->user;
    args.ray = (RTCRayN *)ray;
    args.hit = local_e8;
    args.N = 4;
    local_378 = auVar49;
    if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
      local_368 = lVar25;
      (*pGVar6->occlusionFilterN)(&args);
      auVar257 = ZEXT3264(_DAT_01fb9fe0);
      auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar256 = ZEXT1664(auVar47);
      auVar109 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar255 = ZEXT3264(auVar109);
      auVar47 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar261 = ZEXT1664(auVar47);
      auVar260 = ZEXT464(0x3f800000);
      auVar47 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar258 = ZEXT1664(auVar47);
      auVar47 = vxorps_avx512vl(auVar87,auVar87);
      auVar254 = ZEXT1664(auVar47);
      auVar109._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar259 = ZEXT1664(auVar109._0_16_);
      lVar25 = local_368;
    }
    auVar47 = auVar109._16_16_;
    auVar36 = auVar254._0_16_;
    uVar33 = vptestmd_avx512vl(local_378,local_378);
    if ((uVar33 & 0xf) != 0) {
      p_Var8 = context->args->filter;
      if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
           RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
        (*p_Var8)(&args);
        auVar257 = ZEXT3264(_DAT_01fb9fe0);
        auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
        auVar256 = ZEXT1664(auVar47);
        auVar109 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar255 = ZEXT3264(auVar109);
        auVar47 = auVar109._16_16_;
        auVar87 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar261 = ZEXT1664(auVar87);
        auVar260 = ZEXT464(0x3f800000);
        auVar87 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar258 = ZEXT1664(auVar87);
        auVar36 = vxorps_avx512vl(auVar36,auVar36);
        auVar254 = ZEXT1664(auVar36);
        auVar36 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar259 = ZEXT1664(auVar36);
      }
      uVar33 = vptestmd_avx512vl(local_378,local_378);
      uVar33 = uVar33 & 0xf;
      auVar36 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      bVar31 = (bool)((byte)uVar33 & 1);
      auVar88._0_4_ = (uint)bVar31 * auVar36._0_4_ | (uint)!bVar31 * *(int *)(args.ray + 0x80);
      bVar31 = (bool)((byte)(uVar33 >> 1) & 1);
      auVar88._4_4_ = (uint)bVar31 * auVar36._4_4_ | (uint)!bVar31 * *(int *)(args.ray + 0x84);
      bVar31 = (bool)((byte)(uVar33 >> 2) & 1);
      auVar88._8_4_ = (uint)bVar31 * auVar36._8_4_ | (uint)!bVar31 * *(int *)(args.ray + 0x88);
      bVar31 = SUB81(uVar33 >> 3,0);
      auVar88._12_4_ = (uint)bVar31 * auVar36._12_4_ | (uint)!bVar31 * *(int *)(args.ray + 0x8c);
      auVar109._16_16_ = auVar47;
      auVar109._0_16_ = auVar88;
      *(undefined1 (*) [16])(args.ray + 0x80) = auVar88;
      bVar19 = 1;
      if ((byte)uVar33 != 0) goto LAB_019312f1;
    }
    *(float *)(ray + k * 4 + 0x80) = fVar220;
  }
  bVar19 = 0;
LAB_019312f1:
  bVar28 = (bool)(bVar28 | bVar19);
  goto LAB_01930497;
LAB_019312fc:
  auVar36 = vinsertps_avx(auVar80,auVar162,0x10);
  goto LAB_0192ff37;
}

Assistant:

static __forceinline bool occluded_hn(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedHermiteCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }